

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  long lVar82;
  uint uVar83;
  ulong uVar84;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined4 uVar85;
  undefined8 unaff_R14;
  ulong uVar86;
  bool bVar87;
  float fVar88;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined8 uVar89;
  float fVar117;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar90 [16];
  undefined1 auVar110 [32];
  undefined1 auVar96 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar100 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar111 [32];
  undefined1 auVar116 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar139;
  undefined1 auVar147 [16];
  float fVar154;
  float fVar156;
  float fVar160;
  float fVar162;
  float fVar164;
  undefined1 auVar148 [32];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar240 [64];
  undefined1 auVar242 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar243 [64];
  float fVar244;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar245 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [28];
  float fVar266;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar267;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c64;
  undefined1 local_c60 [8];
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  uint uStack_bc4;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 auStack_b30 [16];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 (*local_ac8) [16];
  undefined1 local_ac0 [32];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 uStack_a88;
  undefined4 uStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  Primitive *local_950;
  Primitive *local_948;
  undefined4 local_940;
  undefined1 auStack_93c [28];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  uint local_790;
  uint uStack_78c;
  uint uStack_788;
  uint uStack_784;
  RTCHitN local_780 [16];
  undefined1 auStack_770 [16];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  uint uStack_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined4 uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 auVar241 [32];
  undefined1 auVar246 [32];
  
  PVar5 = prim[1];
  uVar86 = (ulong)(byte)PVar5;
  local_950 = prim + uVar86 * 0x19 + 0x16;
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar88 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  auVar92._0_4_ = fVar88 * auVar10._0_4_;
  auVar92._4_4_ = fVar88 * auVar10._4_4_;
  auVar92._8_4_ = fVar88 * auVar10._8_4_;
  auVar92._12_4_ = fVar88 * auVar10._12_4_;
  auVar204._0_4_ = fVar88 * auVar11._0_4_;
  auVar204._4_4_ = fVar88 * auVar11._4_4_;
  auVar204._8_4_ = fVar88 * auVar11._8_4_;
  auVar204._12_4_ = fVar88 * auVar11._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar10);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar86 * 5 + 6);
  auVar227 = vpmovsxbd_avx2(auVar11);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar86 * 6 + 6);
  auVar109 = vpmovsxbd_avx2(auVar1);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar14 = vpmovsxbd_avx2(auVar2);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar86 * 0xc + 6);
  auVar15 = vpmovsxbd_avx2(auVar95);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar185 = vpmovsxbd_avx2(auVar3);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar16 = vpmovsxbd_avx2(auVar4);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar86 * 0x13 + 6);
  auVar201 = vpmovsxbd_avx2(auVar124);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar86 * 0x14 + 6);
  auVar17 = vpmovsxbd_avx2(auVar146);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar260._4_4_ = auVar204._0_4_;
  auVar260._0_4_ = auVar204._0_4_;
  auVar260._8_4_ = auVar204._0_4_;
  auVar260._12_4_ = auVar204._0_4_;
  auVar260._16_4_ = auVar204._0_4_;
  auVar260._20_4_ = auVar204._0_4_;
  auVar260._24_4_ = auVar204._0_4_;
  auVar260._28_4_ = auVar204._0_4_;
  auVar10 = vmovshdup_avx(auVar204);
  uVar89 = auVar10._0_8_;
  auVar274._8_8_ = uVar89;
  auVar274._0_8_ = uVar89;
  auVar274._16_8_ = uVar89;
  auVar274._24_8_ = uVar89;
  auVar10 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar88 = auVar10._0_4_;
  auVar249._0_4_ = fVar88 * auVar109._0_4_;
  fVar117 = auVar10._4_4_;
  auVar249._4_4_ = fVar117 * auVar109._4_4_;
  auVar249._8_4_ = fVar88 * auVar109._8_4_;
  auVar249._12_4_ = fVar117 * auVar109._12_4_;
  auVar249._16_4_ = fVar88 * auVar109._16_4_;
  auVar249._20_4_ = fVar117 * auVar109._20_4_;
  auVar249._28_36_ = in_ZMM10._28_36_;
  auVar249._24_4_ = fVar88 * auVar109._24_4_;
  auVar243._0_4_ = auVar185._0_4_ * fVar88;
  auVar243._4_4_ = auVar185._4_4_ * fVar117;
  auVar243._8_4_ = auVar185._8_4_ * fVar88;
  auVar243._12_4_ = auVar185._12_4_ * fVar117;
  auVar243._16_4_ = auVar185._16_4_ * fVar88;
  auVar243._20_4_ = auVar185._20_4_ * fVar117;
  auVar243._28_36_ = in_ZMM9._28_36_;
  auVar243._24_4_ = auVar185._24_4_ * fVar88;
  auVar225._0_4_ = auVar17._0_4_ * fVar88;
  auVar225._4_4_ = auVar17._4_4_ * fVar117;
  auVar225._8_4_ = auVar17._8_4_ * fVar88;
  auVar225._12_4_ = auVar17._12_4_ * fVar117;
  auVar225._16_4_ = auVar17._16_4_ * fVar88;
  auVar225._20_4_ = auVar17._20_4_ * fVar117;
  auVar225._24_4_ = auVar17._24_4_ * fVar88;
  auVar225._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar249._0_32_,auVar274,auVar227);
  auVar11 = vfmadd231ps_fma(auVar243._0_32_,auVar274,auVar15);
  auVar1 = vfmadd231ps_fma(auVar225,auVar201,auVar274);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar260,auVar101);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar260,auVar14);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar16,auVar260);
  auVar261._4_4_ = auVar92._0_4_;
  auVar261._0_4_ = auVar92._0_4_;
  auVar261._8_4_ = auVar92._0_4_;
  auVar261._12_4_ = auVar92._0_4_;
  auVar261._16_4_ = auVar92._0_4_;
  auVar261._20_4_ = auVar92._0_4_;
  auVar261._24_4_ = auVar92._0_4_;
  auVar261._28_4_ = auVar92._0_4_;
  auVar10 = vmovshdup_avx(auVar92);
  uVar89 = auVar10._0_8_;
  auVar275._8_8_ = uVar89;
  auVar275._0_8_ = uVar89;
  auVar275._16_8_ = uVar89;
  auVar275._24_8_ = uVar89;
  auVar10 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar88 = auVar10._0_4_;
  auVar210._0_4_ = fVar88 * auVar109._0_4_;
  fVar117 = auVar10._4_4_;
  auVar210._4_4_ = fVar117 * auVar109._4_4_;
  auVar210._8_4_ = fVar88 * auVar109._8_4_;
  auVar210._12_4_ = fVar117 * auVar109._12_4_;
  auVar210._16_4_ = fVar88 * auVar109._16_4_;
  auVar210._20_4_ = fVar117 * auVar109._20_4_;
  auVar210._24_4_ = fVar88 * auVar109._24_4_;
  auVar210._28_4_ = 0;
  auVar221._4_4_ = auVar185._4_4_ * fVar117;
  auVar221._0_4_ = auVar185._0_4_ * fVar88;
  auVar221._8_4_ = auVar185._8_4_ * fVar88;
  auVar221._12_4_ = auVar185._12_4_ * fVar117;
  auVar221._16_4_ = auVar185._16_4_ * fVar88;
  auVar221._20_4_ = auVar185._20_4_ * fVar117;
  auVar221._24_4_ = auVar185._24_4_ * fVar88;
  auVar221._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar17._4_4_ * fVar117;
  auVar109._0_4_ = auVar17._0_4_ * fVar88;
  auVar109._8_4_ = auVar17._8_4_ * fVar88;
  auVar109._12_4_ = auVar17._12_4_ * fVar117;
  auVar109._16_4_ = auVar17._16_4_ * fVar88;
  auVar109._20_4_ = auVar17._20_4_ * fVar117;
  auVar109._24_4_ = auVar17._24_4_ * fVar88;
  auVar109._28_4_ = fVar117;
  auVar10 = vfmadd231ps_fma(auVar210,auVar275,auVar227);
  auVar95 = vfmadd231ps_fma(auVar221,auVar275,auVar15);
  auVar3 = vfmadd231ps_fma(auVar109,auVar275,auVar201);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar261,auVar101);
  local_6e0._8_4_ = 0x7fffffff;
  local_6e0._0_8_ = 0x7fffffff7fffffff;
  local_6e0._12_4_ = 0x7fffffff;
  local_6e0._16_4_ = 0x7fffffff;
  local_6e0._20_4_ = 0x7fffffff;
  local_6e0._24_4_ = 0x7fffffff;
  local_6e0._28_4_ = 0x7fffffff;
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar261,auVar14);
  auVar101 = vandps_avx(ZEXT1632(auVar2),local_6e0);
  auVar245._8_4_ = 0x219392ef;
  auVar245._0_8_ = 0x219392ef219392ef;
  auVar245._12_4_ = 0x219392ef;
  auVar245._16_4_ = 0x219392ef;
  auVar245._20_4_ = 0x219392ef;
  auVar245._24_4_ = 0x219392ef;
  auVar245._28_4_ = 0x219392ef;
  auVar101 = vcmpps_avx(auVar101,auVar245,1);
  auVar227 = vblendvps_avx(ZEXT1632(auVar2),auVar245,auVar101);
  auVar101 = vandps_avx(ZEXT1632(auVar11),local_6e0);
  auVar101 = vcmpps_avx(auVar101,auVar245,1);
  auVar109 = vblendvps_avx(ZEXT1632(auVar11),auVar245,auVar101);
  auVar101 = vandps_avx(local_6e0,ZEXT1632(auVar1));
  auVar101 = vcmpps_avx(auVar101,auVar245,1);
  auVar14 = vrcpps_avx(auVar227);
  auVar101 = vblendvps_avx(ZEXT1632(auVar1),auVar245,auVar101);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar226._16_4_ = 0x3f800000;
  auVar226._20_4_ = 0x3f800000;
  auVar226._24_4_ = 0x3f800000;
  auVar226._28_4_ = 0x3f800000;
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar261,auVar16);
  auVar15 = vrcpps_avx(auVar109);
  auVar10 = vfnmadd213ps_fma(auVar227,auVar14,auVar226);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar14,auVar14);
  auVar11 = vfnmadd213ps_fma(auVar109,auVar15,auVar226);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar15,auVar15);
  auVar227 = vrcpps_avx(auVar101);
  auVar1 = vfnmadd213ps_fma(auVar101,auVar227,auVar226);
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar227,auVar227);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar4));
  auVar14._4_4_ = auVar10._4_4_ * auVar101._4_4_;
  auVar14._0_4_ = auVar10._0_4_ * auVar101._0_4_;
  auVar14._8_4_ = auVar10._8_4_ * auVar101._8_4_;
  auVar14._12_4_ = auVar10._12_4_ * auVar101._12_4_;
  auVar14._16_4_ = auVar101._16_4_ * 0.0;
  auVar14._20_4_ = auVar101._20_4_ * 0.0;
  auVar14._24_4_ = auVar101._24_4_ * 0.0;
  auVar14._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 9 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar4));
  auVar15._4_4_ = auVar10._4_4_ * auVar101._4_4_;
  auVar15._0_4_ = auVar10._0_4_ * auVar101._0_4_;
  auVar15._8_4_ = auVar10._8_4_ * auVar101._8_4_;
  auVar15._12_4_ = auVar10._12_4_ * auVar101._12_4_;
  auVar15._16_4_ = auVar101._16_4_ * 0.0;
  auVar15._20_4_ = auVar101._20_4_ * 0.0;
  auVar15._24_4_ = auVar101._24_4_ * 0.0;
  auVar15._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0xe + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar95));
  auVar185._4_4_ = auVar11._4_4_ * auVar101._4_4_;
  auVar185._0_4_ = auVar11._0_4_ * auVar101._0_4_;
  auVar185._8_4_ = auVar11._8_4_ * auVar101._8_4_;
  auVar185._12_4_ = auVar11._12_4_ * auVar101._12_4_;
  auVar185._16_4_ = auVar101._16_4_ * 0.0;
  auVar185._20_4_ = auVar101._20_4_ * 0.0;
  auVar185._24_4_ = auVar101._24_4_ * 0.0;
  auVar185._28_4_ = auVar101._28_4_;
  auVar131._1_3_ = 0;
  auVar131[0] = PVar5;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar95));
  auVar16._4_4_ = auVar11._4_4_ * auVar101._4_4_;
  auVar16._0_4_ = auVar11._0_4_ * auVar101._0_4_;
  auVar16._8_4_ = auVar11._8_4_ * auVar101._8_4_;
  auVar16._12_4_ = auVar11._12_4_ * auVar101._12_4_;
  auVar16._16_4_ = auVar101._16_4_ * 0.0;
  auVar16._20_4_ = auVar101._20_4_ * 0.0;
  auVar16._24_4_ = auVar101._24_4_ * 0.0;
  auVar16._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x15 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar2));
  auVar201._4_4_ = auVar101._4_4_ * auVar1._4_4_;
  auVar201._0_4_ = auVar101._0_4_ * auVar1._0_4_;
  auVar201._8_4_ = auVar101._8_4_ * auVar1._8_4_;
  auVar201._12_4_ = auVar101._12_4_ * auVar1._12_4_;
  auVar201._16_4_ = auVar101._16_4_ * 0.0;
  auVar201._20_4_ = auVar101._20_4_ * 0.0;
  auVar201._24_4_ = auVar101._24_4_ * 0.0;
  auVar201._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar2));
  auVar17._4_4_ = auVar1._4_4_ * auVar101._4_4_;
  auVar17._0_4_ = auVar1._0_4_ * auVar101._0_4_;
  auVar17._8_4_ = auVar1._8_4_ * auVar101._8_4_;
  auVar17._12_4_ = auVar1._12_4_ * auVar101._12_4_;
  auVar17._16_4_ = auVar101._16_4_ * 0.0;
  auVar17._20_4_ = auVar101._20_4_ * 0.0;
  auVar17._24_4_ = auVar101._24_4_ * 0.0;
  auVar17._28_4_ = auVar101._28_4_;
  auVar101 = vpminsd_avx2(auVar14,auVar15);
  auVar227 = vpminsd_avx2(auVar185,auVar16);
  auVar101 = vmaxps_avx(auVar101,auVar227);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar234._4_4_ = uVar85;
  auVar234._0_4_ = uVar85;
  auVar234._8_4_ = uVar85;
  auVar234._12_4_ = uVar85;
  auVar234._16_4_ = uVar85;
  auVar234._20_4_ = uVar85;
  auVar234._24_4_ = uVar85;
  auVar234._28_4_ = uVar85;
  auVar227 = vpminsd_avx2(auVar201,auVar17);
  auVar227 = vmaxps_avx(auVar227,auVar234);
  auVar101 = vmaxps_avx(auVar101,auVar227);
  local_3c0._4_4_ = auVar101._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar101._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar101._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar101._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar101._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar101._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar101._24_4_ * 0.99999964;
  local_3c0._28_4_ = auVar227._28_4_;
  auVar101 = vpmaxsd_avx2(auVar14,auVar15);
  auVar227 = vpmaxsd_avx2(auVar185,auVar16);
  auVar101 = vminps_avx(auVar101,auVar227);
  auVar227 = vpmaxsd_avx2(auVar201,auVar17);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar148._4_4_ = uVar85;
  auVar148._0_4_ = uVar85;
  auVar148._8_4_ = uVar85;
  auVar148._12_4_ = uVar85;
  auVar148._16_4_ = uVar85;
  auVar148._20_4_ = uVar85;
  auVar148._24_4_ = uVar85;
  auVar148._28_4_ = uVar85;
  auVar227 = vminps_avx(auVar227,auVar148);
  auVar101 = vminps_avx(auVar101,auVar227);
  auVar219._4_4_ = auVar101._4_4_ * 1.0000004;
  auVar219._0_4_ = auVar101._0_4_ * 1.0000004;
  auVar219._8_4_ = auVar101._8_4_ * 1.0000004;
  auVar219._12_4_ = auVar101._12_4_ * 1.0000004;
  auVar219._16_4_ = auVar101._16_4_ * 1.0000004;
  auVar219._20_4_ = auVar101._20_4_ * 1.0000004;
  auVar219._24_4_ = auVar101._24_4_ * 1.0000004;
  auVar219._28_4_ = auVar101._28_4_;
  auVar131[4] = PVar5;
  auVar131._5_3_ = 0;
  auVar131[8] = PVar5;
  auVar131._9_3_ = 0;
  auVar131[0xc] = PVar5;
  auVar131._13_3_ = 0;
  auVar131[0x10] = PVar5;
  auVar131._17_3_ = 0;
  auVar131[0x14] = PVar5;
  auVar131._21_3_ = 0;
  auVar131[0x18] = PVar5;
  auVar131._25_3_ = 0;
  auVar131[0x1c] = PVar5;
  auVar131._29_3_ = 0;
  auVar227 = vpcmpgtd_avx2(auVar131,_DAT_01fb4ba0);
  auVar101 = vcmpps_avx(local_3c0,auVar219,2);
  auVar101 = vandps_avx(auVar101,auVar227);
  uVar85 = vmovmskps_avx(auVar101);
  uVar86 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar85);
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_560 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  local_ac8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_948 = prim;
LAB_012c15dc:
  if (uVar86 == 0) {
    return;
  }
  lVar82 = 0;
  for (uVar81 = uVar86; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar86 = uVar86 - 1 & uVar86;
  local_940 = *(undefined4 *)(local_948 + lVar82 * 4 + 6);
  uVar81 = (ulong)(uint)((int)lVar82 << 6);
  auVar10 = *(undefined1 (*) [16])(local_950 + uVar81);
  if (uVar86 != 0) {
    uVar84 = uVar86 - 1 & uVar86;
    for (uVar19 = uVar86; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    }
    if (uVar84 != 0) {
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar11 = *(undefined1 (*) [16])(local_950 + uVar81 + 0x10);
  auVar1 = *(undefined1 (*) [16])(local_950 + uVar81 + 0x20);
  auVar2 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar2,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar143._4_4_ = uVar85;
  auVar143._0_4_ = uVar85;
  auVar143._8_4_ = uVar85;
  auVar143._12_4_ = uVar85;
  fStack_6b0 = (float)uVar85;
  _local_6c0 = auVar143;
  fStack_6ac = (float)uVar85;
  fStack_6a8 = (float)uVar85;
  uStack_6a4 = uVar85;
  auVar2 = *(undefined1 (*) [16])(local_950 + uVar81 + 0x30);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar257._4_4_ = uVar85;
  auVar257._0_4_ = uVar85;
  auVar257._8_4_ = uVar85;
  auVar257._12_4_ = uVar85;
  fStack_990 = (float)uVar85;
  _local_9a0 = auVar257;
  fStack_98c = (float)uVar85;
  fStack_988 = (float)uVar85;
  register0x0000155c = uVar85;
  auVar95 = vunpcklps_avx(auVar143,auVar257);
  fVar88 = *(float *)(ray + k * 4 + 0x60);
  auVar272._4_4_ = fVar88;
  auVar272._0_4_ = fVar88;
  auVar272._8_4_ = fVar88;
  auVar272._12_4_ = fVar88;
  fStack_9b0 = fVar88;
  _local_9c0 = auVar272;
  fStack_9ac = fVar88;
  fStack_9a8 = fVar88;
  uStack_9a4 = fVar88;
  local_9d0 = vinsertps_avx(auVar95,auVar272,0x28);
  auVar205._0_4_ = (auVar10._0_4_ + auVar11._0_4_ + auVar1._0_4_ + auVar2._0_4_) * 0.25;
  auVar205._4_4_ = (auVar10._4_4_ + auVar11._4_4_ + auVar1._4_4_ + auVar2._4_4_) * 0.25;
  auVar205._8_4_ = (auVar10._8_4_ + auVar11._8_4_ + auVar1._8_4_ + auVar2._8_4_) * 0.25;
  auVar205._12_4_ = (auVar10._12_4_ + auVar11._12_4_ + auVar1._12_4_ + auVar2._12_4_) * 0.25;
  auVar95 = vsubps_avx(auVar205,auVar3);
  auVar95 = vdpps_avx(auVar95,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  uVar80 = *(uint *)(local_948 + 2);
  auVar4 = vrcpss_avx(local_9e0,local_9e0);
  auVar124 = vfnmadd213ss_fma(auVar4,local_9e0,ZEXT416(0x40000000));
  local_3a0 = auVar95._0_4_ * auVar4._0_4_ * auVar124._0_4_;
  auVar216._4_4_ = local_3a0;
  auVar216._0_4_ = local_3a0;
  auVar216._8_4_ = local_3a0;
  auVar216._12_4_ = local_3a0;
  fStack_8f0 = local_3a0;
  _local_900 = auVar216;
  fStack_8ec = local_3a0;
  fStack_8e8 = local_3a0;
  fStack_8e4 = local_3a0;
  auVar95 = vfmadd231ps_fma(auVar3,local_9d0,auVar216);
  auVar95 = vblendps_avx(auVar95,_DAT_01f45a50,8);
  auVar3 = vsubps_avx(auVar10,auVar95);
  auVar1 = vsubps_avx(auVar1,auVar95);
  auVar4 = vsubps_avx(auVar11,auVar95);
  auVar2 = vsubps_avx(auVar2,auVar95);
  auVar10 = vmovshdup_avx(auVar3);
  uVar89 = auVar10._0_8_;
  auVar197._8_8_ = uVar89;
  auVar197._0_8_ = uVar89;
  auVar197._16_8_ = uVar89;
  auVar197._24_8_ = uVar89;
  auVar10 = vshufps_avx(auVar3,auVar3,0xaa);
  uVar89 = auVar10._0_8_;
  auVar227._8_8_ = uVar89;
  auVar227._0_8_ = uVar89;
  auVar227._16_8_ = uVar89;
  auVar227._24_8_ = uVar89;
  auVar10 = vshufps_avx(auVar3,auVar3,0xff);
  uVar89 = auVar10._0_8_;
  auVar235._8_8_ = uVar89;
  auVar235._0_8_ = uVar89;
  auVar235._16_8_ = uVar89;
  auVar235._24_8_ = uVar89;
  auVar10 = vmovshdup_avx(auVar4);
  uVar89 = auVar10._0_8_;
  auVar241._8_8_ = uVar89;
  auVar241._0_8_ = uVar89;
  auVar241._16_8_ = uVar89;
  auVar241._24_8_ = uVar89;
  auVar243 = ZEXT3264(auVar241);
  auVar10 = vshufps_avx(auVar4,auVar4,0xaa);
  uVar89 = auVar10._0_8_;
  auVar246._8_8_ = uVar89;
  auVar246._0_8_ = uVar89;
  auVar246._16_8_ = uVar89;
  auVar246._24_8_ = uVar89;
  auVar249 = ZEXT3264(auVar246);
  auVar10 = vshufps_avx(auVar4,auVar4,0xff);
  uVar89 = auVar10._0_8_;
  local_360._8_8_ = uVar89;
  local_360._0_8_ = uVar89;
  local_360._16_8_ = uVar89;
  local_360._24_8_ = uVar89;
  auVar10 = vmovshdup_avx(auVar1);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vshufps_avx(auVar1,auVar1,0xaa);
  local_520 = auVar10._0_4_;
  fStack_51c = auVar10._4_4_;
  auVar10 = vshufps_avx(auVar1,auVar1,0xff);
  local_200 = auVar10._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar10 = vmovshdup_avx(auVar2);
  local_220 = auVar10._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar10 = vshufps_avx(auVar2,auVar2,0xaa);
  local_240 = auVar10._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar10 = vshufps_avx(auVar2,auVar2,0xff);
  local_260 = auVar10._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar10 = vfmadd231ps_fma(ZEXT432((uint)(fVar88 * fVar88)),_local_9a0,_local_9a0);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_6c0,_local_6c0);
  uVar85 = auVar10._0_4_;
  local_280._4_4_ = uVar85;
  local_280._0_4_ = uVar85;
  local_280._8_4_ = uVar85;
  local_280._12_4_ = uVar85;
  local_280._16_4_ = uVar85;
  local_280._20_4_ = uVar85;
  local_280._24_4_ = uVar85;
  local_280._28_4_ = uVar85;
  fVar88 = *(float *)(ray + k * 4 + 0x30);
  local_970 = ZEXT416((uint)local_3a0);
  local_3a0 = fVar88 - local_3a0;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar81 = 0;
  local_c64 = 1;
  uVar85 = auVar3._0_4_;
  local_380._4_4_ = uVar85;
  local_380._0_4_ = uVar85;
  local_380._8_4_ = uVar85;
  local_380._12_4_ = uVar85;
  local_380._16_4_ = uVar85;
  local_380._20_4_ = uVar85;
  local_380._24_4_ = uVar85;
  local_380._28_4_ = uVar85;
  fVar117 = auVar4._0_4_;
  local_a40._4_4_ = fVar117;
  local_a40._0_4_ = fVar117;
  local_a40._8_4_ = fVar117;
  local_a40._12_4_ = fVar117;
  local_a40._16_4_ = fVar117;
  local_a40._20_4_ = fVar117;
  local_a40._24_4_ = fVar117;
  local_a40._28_4_ = fVar117;
  auVar265 = ZEXT3264(local_a40);
  fVar139 = auVar1._0_4_;
  local_540 = fVar139;
  fStack_53c = fVar139;
  fStack_538 = fVar139;
  fStack_534 = fVar139;
  fStack_530 = fVar139;
  fStack_52c = fVar139;
  fStack_528 = fVar139;
  fStack_524 = fVar139;
  fVar167 = auVar2._0_4_;
  local_2a0 = fVar167;
  fStack_29c = fVar167;
  fStack_298 = fVar167;
  fStack_294 = fVar167;
  fStack_290 = fVar167;
  fStack_28c = fVar167;
  fStack_288 = fVar167;
  fStack_284 = fVar167;
  local_600 = vandps_avx(local_280,local_6e0);
  auVar10 = vsqrtss_avx(local_9e0,local_9e0);
  auVar11 = vsqrtss_avx(local_9e0,local_9e0);
  local_610 = ZEXT816(0x3f80000000000000);
  local_580 = auVar197;
  local_5a0 = auVar227;
  local_5c0 = auVar241;
  local_5e0 = auVar246;
  local_a20 = auVar235;
  local_7a0 = local_940;
  uStack_79c = local_940;
  uStack_798 = local_940;
  uStack_794 = local_940;
  local_790 = uVar80;
  uStack_78c = uVar80;
  uStack_788 = uVar80;
  uStack_784 = uVar80;
  fStack_518 = local_520;
  fStack_514 = fStack_51c;
  fStack_510 = local_520;
  fStack_50c = fStack_51c;
  fStack_508 = local_520;
  fStack_504 = fStack_51c;
  do {
    auVar182._8_4_ = 0x3f800000;
    auVar182._0_8_ = 0x3f8000003f800000;
    auVar182._12_4_ = 0x3f800000;
    auVar182._16_4_ = 0x3f800000;
    auVar182._20_4_ = 0x3f800000;
    auVar182._24_4_ = 0x3f800000;
    auVar182._28_4_ = 0x3f800000;
    auVar95 = vmovshdup_avx(local_610);
    auVar95 = vsubps_avx(auVar95,local_610);
    fVar141 = auVar95._0_4_;
    fVar164 = fVar141 * 0.04761905;
    local_800._0_4_ = local_610._0_4_;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    local_820._4_4_ = fVar141;
    local_820._0_4_ = fVar141;
    local_820._8_4_ = fVar141;
    local_820._12_4_ = fVar141;
    local_820._16_4_ = fVar141;
    local_820._20_4_ = fVar141;
    local_820._24_4_ = fVar141;
    local_820._28_4_ = fVar141;
    auVar95 = vfmadd231ps_fma(local_800,local_820,_DAT_01f7b040);
    auVar101 = vsubps_avx(auVar182,ZEXT1632(auVar95));
    fVar141 = auVar95._0_4_;
    auVar271._0_4_ = auVar265._0_4_ * fVar141;
    fVar155 = auVar95._4_4_;
    auVar271._4_4_ = auVar265._4_4_ * fVar155;
    fVar140 = auVar95._8_4_;
    auVar271._8_4_ = auVar265._8_4_ * fVar140;
    fVar157 = auVar95._12_4_;
    auVar271._12_4_ = auVar265._12_4_ * fVar157;
    auVar271._16_4_ = auVar265._16_4_ * 0.0;
    auVar271._20_4_ = auVar265._20_4_ * 0.0;
    auVar271._28_36_ = auVar249._28_36_;
    auVar271._24_4_ = auVar265._24_4_ * 0.0;
    auVar240._0_4_ = auVar241._0_4_ * fVar141;
    auVar240._4_4_ = auVar241._4_4_ * fVar155;
    auVar240._8_4_ = auVar241._8_4_ * fVar140;
    auVar240._12_4_ = auVar241._12_4_ * fVar157;
    auVar240._16_4_ = auVar241._16_4_ * 0.0;
    auVar240._20_4_ = auVar241._20_4_ * 0.0;
    auVar240._28_36_ = auVar243._28_36_;
    auVar240._24_4_ = auVar241._24_4_ * 0.0;
    auVar20._4_4_ = auVar246._4_4_ * fVar155;
    auVar20._0_4_ = auVar246._0_4_ * fVar141;
    auVar20._8_4_ = auVar246._8_4_ * fVar140;
    auVar20._12_4_ = auVar246._12_4_ * fVar157;
    auVar20._16_4_ = auVar246._16_4_ * 0.0;
    auVar20._20_4_ = auVar246._20_4_ * 0.0;
    auVar20._24_4_ = auVar246._24_4_ * 0.0;
    auVar20._28_4_ = auVar246._28_4_;
    auVar21._4_4_ = local_360._4_4_ * fVar155;
    auVar21._0_4_ = local_360._0_4_ * fVar141;
    auVar21._8_4_ = local_360._8_4_ * fVar140;
    auVar21._12_4_ = local_360._12_4_ * fVar157;
    auVar21._16_4_ = local_360._16_4_ * 0.0;
    auVar21._20_4_ = local_360._20_4_ * 0.0;
    auVar21._24_4_ = local_360._24_4_ * 0.0;
    auVar21._28_4_ = auVar241._28_4_;
    auVar95 = vfmadd231ps_fma(auVar271._0_32_,auVar101,local_380);
    auVar124 = vfmadd231ps_fma(auVar240._0_32_,auVar101,auVar197);
    auVar146 = vfmadd231ps_fma(auVar20,auVar101,auVar227);
    auVar92 = vfmadd231ps_fma(auVar21,auVar101,auVar235);
    auVar22._4_4_ = fVar155 * fStack_53c;
    auVar22._0_4_ = fVar141 * local_540;
    auVar22._8_4_ = fVar140 * fStack_538;
    auVar22._12_4_ = fVar157 * fStack_534;
    auVar22._16_4_ = fStack_530 * 0.0;
    auVar22._20_4_ = fStack_52c * 0.0;
    auVar22._24_4_ = fStack_528 * 0.0;
    auVar22._28_4_ = auVar235._28_4_;
    auVar77._8_8_ = uStack_1d8;
    auVar77._0_8_ = local_1e0;
    auVar77._16_8_ = uStack_1d0;
    auVar77._24_8_ = uStack_1c8;
    auVar23._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar155;
    auVar23._0_4_ = (float)local_1e0 * fVar141;
    auVar23._8_4_ = (float)uStack_1d8 * fVar140;
    auVar23._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar157;
    auVar23._16_4_ = (float)uStack_1d0 * 0.0;
    auVar23._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar23._24_4_ = (float)uStack_1c8 * 0.0;
    auVar23._28_4_ = auVar227._28_4_;
    auVar78._4_4_ = fVar155 * fStack_51c;
    auVar78._0_4_ = fVar141 * local_520;
    auVar78._8_4_ = fVar140 * fStack_518;
    auVar78._12_4_ = fVar157 * fStack_514;
    auVar78._16_4_ = fStack_510 * 0.0;
    auVar78._20_4_ = fStack_50c * 0.0;
    auVar78._24_4_ = fStack_508 * 0.0;
    auVar78._28_4_ = DAT_01f7b040._28_4_;
    auVar76._8_8_ = uStack_1f8;
    auVar76._0_8_ = local_200;
    auVar76._16_8_ = uStack_1f0;
    auVar76._24_8_ = uStack_1e8;
    auVar24._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar155;
    auVar24._0_4_ = (float)local_200 * fVar141;
    auVar24._8_4_ = (float)uStack_1f8 * fVar140;
    auVar24._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar157;
    auVar24._16_4_ = (float)uStack_1f0 * 0.0;
    auVar24._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar24._24_4_ = (float)uStack_1e8 * 0.0;
    auVar24._28_4_ = 0x3f800000;
    auVar204 = vfmadd231ps_fma(auVar22,auVar101,auVar265._0_32_);
    auVar205 = vfmadd231ps_fma(auVar23,auVar101,auVar241);
    auVar216 = vfmadd231ps_fma(auVar78,auVar101,auVar246);
    auVar143 = vfmadd231ps_fma(auVar24,auVar101,local_360);
    auVar25._4_4_ = fVar155 * fStack_29c;
    auVar25._0_4_ = fVar141 * local_2a0;
    auVar25._8_4_ = fVar140 * fStack_298;
    auVar25._12_4_ = fVar157 * fStack_294;
    auVar25._16_4_ = fStack_290 * 0.0;
    auVar25._20_4_ = fStack_28c * 0.0;
    auVar25._24_4_ = fStack_288 * 0.0;
    auVar25._28_4_ = auVar246._28_4_;
    auVar26._4_4_ = fVar155 * local_220._4_4_;
    auVar26._0_4_ = fVar141 * (float)local_220;
    auVar26._8_4_ = fVar140 * (float)uStack_218;
    auVar26._12_4_ = fVar157 * uStack_218._4_4_;
    auVar26._16_4_ = (float)uStack_210 * 0.0;
    auVar26._20_4_ = uStack_210._4_4_ * 0.0;
    auVar26._24_4_ = (float)uStack_208 * 0.0;
    auVar26._28_4_ = auVar241._28_4_;
    auVar27._28_4_ = auVar265._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar204._12_4_ * fVar157,
                            CONCAT48(auVar204._8_4_ * fVar140,
                                     CONCAT44(auVar204._4_4_ * fVar155,auVar204._0_4_ * fVar141))));
    auVar95 = vfmadd231ps_fma(auVar27,auVar101,ZEXT1632(auVar95));
    auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar205._12_4_,
                                                  CONCAT48(fVar140 * auVar205._8_4_,
                                                           CONCAT44(fVar155 * auVar205._4_4_,
                                                                    fVar141 * auVar205._0_4_)))),
                               auVar101,ZEXT1632(auVar124));
    auVar146 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar216._12_4_,
                                                  CONCAT48(fVar140 * auVar216._8_4_,
                                                           CONCAT44(fVar155 * auVar216._4_4_,
                                                                    fVar141 * auVar216._0_4_)))),
                               auVar101,ZEXT1632(auVar146));
    auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar143._12_4_,
                                                 CONCAT48(fVar140 * auVar143._8_4_,
                                                          CONCAT44(fVar155 * auVar143._4_4_,
                                                                   fVar141 * auVar143._0_4_)))),
                              auVar101,ZEXT1632(auVar92));
    auVar228._0_4_ = fVar141 * (float)local_240;
    auVar228._4_4_ = fVar155 * local_240._4_4_;
    auVar228._8_4_ = fVar140 * (float)uStack_238;
    auVar228._12_4_ = fVar157 * uStack_238._4_4_;
    auVar228._16_4_ = (float)uStack_230 * 0.0;
    auVar228._20_4_ = uStack_230._4_4_ * 0.0;
    auVar228._24_4_ = (float)uStack_228 * 0.0;
    auVar228._28_4_ = 0;
    auVar71._4_4_ = fStack_53c;
    auVar71._0_4_ = local_540;
    auVar71._8_4_ = fStack_538;
    auVar71._12_4_ = fStack_534;
    auVar71._16_4_ = fStack_530;
    auVar71._20_4_ = fStack_52c;
    auVar71._24_4_ = fStack_528;
    auVar71._28_4_ = fStack_524;
    auVar257 = vfmadd231ps_fma(auVar25,auVar101,auVar71);
    auVar204 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar257._12_4_ * fVar157,
                                                  CONCAT48(auVar257._8_4_ * fVar140,
                                                           CONCAT44(auVar257._4_4_ * fVar155,
                                                                    auVar257._0_4_ * fVar141)))),
                               auVar101,ZEXT1632(auVar204));
    auVar236._0_4_ = fVar141 * (float)local_260;
    auVar236._4_4_ = fVar155 * local_260._4_4_;
    auVar236._8_4_ = fVar140 * (float)uStack_258;
    auVar236._12_4_ = fVar157 * uStack_258._4_4_;
    auVar236._16_4_ = (float)uStack_250 * 0.0;
    auVar236._20_4_ = uStack_250._4_4_ * 0.0;
    auVar236._24_4_ = (float)uStack_248 * 0.0;
    auVar236._28_4_ = 0;
    auVar257 = vfmadd231ps_fma(auVar26,auVar101,auVar77);
    auVar72._4_4_ = fStack_51c;
    auVar72._0_4_ = local_520;
    auVar72._8_4_ = fStack_518;
    auVar72._12_4_ = fStack_514;
    auVar72._16_4_ = fStack_510;
    auVar72._20_4_ = fStack_50c;
    auVar72._24_4_ = fStack_508;
    auVar72._28_4_ = fStack_504;
    auVar272 = vfmadd231ps_fma(auVar228,auVar101,auVar72);
    auVar97 = vfmadd231ps_fma(auVar236,auVar101,auVar76);
    auVar28._28_4_ = local_360._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar97._12_4_ * fVar157,
                            CONCAT48(auVar97._8_4_ * fVar140,
                                     CONCAT44(auVar97._4_4_ * fVar155,auVar97._0_4_ * fVar141))));
    auVar205 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar257._12_4_ * fVar157,
                                                  CONCAT48(auVar257._8_4_ * fVar140,
                                                           CONCAT44(auVar257._4_4_ * fVar155,
                                                                    auVar257._0_4_ * fVar141)))),
                               auVar101,ZEXT1632(auVar205));
    auVar216 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar272._12_4_,
                                                  CONCAT48(fVar140 * auVar272._8_4_,
                                                           CONCAT44(fVar155 * auVar272._4_4_,
                                                                    fVar141 * auVar272._0_4_)))),
                               auVar101,ZEXT1632(auVar216));
    auVar143 = vfmadd231ps_fma(auVar28,auVar101,ZEXT1632(auVar143));
    auVar29._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar204._12_4_ * fVar157,
                            CONCAT48(auVar204._8_4_ * fVar140,
                                     CONCAT44(auVar204._4_4_ * fVar155,auVar204._0_4_ * fVar141))));
    auVar30._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar157 * auVar216._12_4_,
                            CONCAT48(fVar140 * auVar216._8_4_,
                                     CONCAT44(fVar155 * auVar216._4_4_,fVar141 * auVar216._0_4_))));
    auVar257 = vfmadd231ps_fma(auVar29,auVar101,ZEXT1632(auVar95));
    auVar272 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar205._12_4_ * fVar157,
                                                  CONCAT48(auVar205._8_4_ * fVar140,
                                                           CONCAT44(auVar205._4_4_ * fVar155,
                                                                    auVar205._0_4_ * fVar141)))),
                               auVar101,ZEXT1632(auVar124));
    auVar221 = ZEXT1632(auVar272);
    auVar272 = vfmadd231ps_fma(auVar30,auVar101,ZEXT1632(auVar146));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar143._12_4_ * fVar157,
                                                 CONCAT48(auVar143._8_4_ * fVar140,
                                                          CONCAT44(auVar143._4_4_ * fVar155,
                                                                   auVar143._0_4_ * fVar141)))),
                              ZEXT1632(auVar92),auVar101);
    auVar101 = vsubps_avx(ZEXT1632(auVar204),ZEXT1632(auVar95));
    auVar227 = vsubps_avx(ZEXT1632(auVar205),ZEXT1632(auVar124));
    auVar109 = vsubps_avx(ZEXT1632(auVar216),ZEXT1632(auVar146));
    auVar14 = vsubps_avx(ZEXT1632(auVar143),ZEXT1632(auVar92));
    local_ac0._0_4_ = fVar164 * auVar101._0_4_ * 3.0;
    local_ac0._4_4_ = fVar164 * auVar101._4_4_ * 3.0;
    local_ac0._8_4_ = fVar164 * auVar101._8_4_ * 3.0;
    local_ac0._12_4_ = fVar164 * auVar101._12_4_ * 3.0;
    local_ac0._16_4_ = fVar164 * auVar101._16_4_ * 3.0;
    local_ac0._20_4_ = fVar164 * auVar101._20_4_ * 3.0;
    local_ac0._24_4_ = fVar164 * auVar101._24_4_ * 3.0;
    local_ac0._28_4_ = 0;
    local_8e0._0_4_ = fVar164 * auVar227._0_4_ * 3.0;
    local_8e0._4_4_ = fVar164 * auVar227._4_4_ * 3.0;
    local_8e0._8_4_ = fVar164 * auVar227._8_4_ * 3.0;
    local_8e0._12_4_ = fVar164 * auVar227._12_4_ * 3.0;
    local_8e0._16_4_ = fVar164 * auVar227._16_4_ * 3.0;
    local_8e0._20_4_ = fVar164 * auVar227._20_4_ * 3.0;
    local_8e0._24_4_ = fVar164 * auVar227._24_4_ * 3.0;
    local_8e0._28_4_ = 0;
    local_7e0._0_4_ = fVar164 * auVar109._0_4_ * 3.0;
    local_7e0._4_4_ = fVar164 * auVar109._4_4_ * 3.0;
    local_7e0._8_4_ = fVar164 * auVar109._8_4_ * 3.0;
    local_7e0._12_4_ = fVar164 * auVar109._12_4_ * 3.0;
    local_7e0._16_4_ = fVar164 * auVar109._16_4_ * 3.0;
    local_7e0._20_4_ = fVar164 * auVar109._20_4_ * 3.0;
    local_7e0._24_4_ = fVar164 * auVar109._24_4_ * 3.0;
    local_7e0._28_4_ = 0;
    fVar140 = fVar164 * auVar14._0_4_ * 3.0;
    fVar154 = fVar164 * auVar14._4_4_ * 3.0;
    auVar31._4_4_ = fVar154;
    auVar31._0_4_ = fVar140;
    fVar156 = fVar164 * auVar14._8_4_ * 3.0;
    auVar31._8_4_ = fVar156;
    fVar158 = fVar164 * auVar14._12_4_ * 3.0;
    auVar31._12_4_ = fVar158;
    fVar160 = fVar164 * auVar14._16_4_ * 3.0;
    auVar31._16_4_ = fVar160;
    fVar162 = fVar164 * auVar14._20_4_ * 3.0;
    auVar31._20_4_ = fVar162;
    fVar164 = fVar164 * auVar14._24_4_ * 3.0;
    auVar31._24_4_ = fVar164;
    auVar31._28_4_ = auVar227._28_4_;
    auVar219 = ZEXT1632(auVar257);
    local_b00 = vpermps_avx2(_DAT_01fb7720,auVar219);
    local_7c0 = vpermps_avx2(_DAT_01fb7720,auVar221);
    local_b20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar272));
    local_2e0 = vsubps_avx(local_b00,ZEXT1632(auVar257));
    local_2c0 = vsubps_avx(local_b20,ZEXT1632(auVar272));
    fVar141 = local_2c0._0_4_;
    fVar157 = local_2c0._4_4_;
    auVar32._4_4_ = local_ac0._4_4_ * fVar157;
    auVar32._0_4_ = (float)local_ac0._0_4_ * fVar141;
    fVar161 = local_2c0._8_4_;
    auVar32._8_4_ = local_ac0._8_4_ * fVar161;
    fVar165 = local_2c0._12_4_;
    auVar32._12_4_ = local_ac0._12_4_ * fVar165;
    fVar276 = local_2c0._16_4_;
    auVar32._16_4_ = local_ac0._16_4_ * fVar276;
    fVar266 = local_2c0._20_4_;
    auVar32._20_4_ = local_ac0._20_4_ * fVar266;
    fVar12 = local_2c0._24_4_;
    auVar32._24_4_ = local_ac0._24_4_ * fVar12;
    auVar32._28_4_ = local_b20._28_4_;
    auVar95 = vfmsub231ps_fma(auVar32,local_7e0,local_2e0);
    local_300 = vsubps_avx(local_7c0,auVar221);
    fVar155 = local_2e0._0_4_;
    fVar159 = local_2e0._4_4_;
    auVar33._4_4_ = local_8e0._4_4_ * fVar159;
    auVar33._0_4_ = (float)local_8e0._0_4_ * fVar155;
    fVar163 = local_2e0._8_4_;
    auVar33._8_4_ = local_8e0._8_4_ * fVar163;
    fVar166 = local_2e0._12_4_;
    auVar33._12_4_ = local_8e0._12_4_ * fVar166;
    fVar277 = local_2e0._16_4_;
    auVar33._16_4_ = local_8e0._16_4_ * fVar277;
    fVar267 = local_2e0._20_4_;
    auVar33._20_4_ = local_8e0._20_4_ * fVar267;
    fVar13 = local_2e0._24_4_;
    auVar33._24_4_ = local_8e0._24_4_ * fVar13;
    auVar33._28_4_ = local_7c0._28_4_;
    auVar124 = vfmsub231ps_fma(auVar33,local_ac0,local_300);
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar124._12_4_ * auVar124._12_4_,
                                                 CONCAT48(auVar124._8_4_ * auVar124._8_4_,
                                                          CONCAT44(auVar124._4_4_ * auVar124._4_4_,
                                                                   auVar124._0_4_ * auVar124._0_4_))
                                                )),ZEXT1632(auVar95),ZEXT1632(auVar95));
    fVar244 = local_300._0_4_;
    auVar183._0_4_ = fVar244 * local_7e0._0_4_;
    fVar250 = local_300._4_4_;
    auVar183._4_4_ = fVar250 * local_7e0._4_4_;
    fVar251 = local_300._8_4_;
    auVar183._8_4_ = fVar251 * local_7e0._8_4_;
    fVar252 = local_300._12_4_;
    auVar183._12_4_ = fVar252 * local_7e0._12_4_;
    fVar253 = local_300._16_4_;
    auVar183._16_4_ = fVar253 * local_7e0._16_4_;
    fVar254 = local_300._20_4_;
    auVar183._20_4_ = fVar254 * local_7e0._20_4_;
    fVar255 = local_300._24_4_;
    auVar183._24_4_ = fVar255 * local_7e0._24_4_;
    auVar183._28_4_ = 0;
    auVar124 = vfmsub231ps_fma(auVar183,local_8e0,local_2c0);
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar124),ZEXT1632(auVar124));
    auVar184._0_4_ = fVar141 * fVar141;
    auVar184._4_4_ = fVar157 * fVar157;
    auVar184._8_4_ = fVar161 * fVar161;
    auVar184._12_4_ = fVar165 * fVar165;
    auVar184._16_4_ = fVar276 * fVar276;
    auVar184._20_4_ = fVar266 * fVar266;
    auVar184._24_4_ = fVar12 * fVar12;
    auVar184._28_4_ = 0;
    auVar95 = vfmadd231ps_fma(auVar184,local_300,local_300);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar95),local_2e0,local_2e0);
    auVar101 = vrcpps_avx(ZEXT1632(auVar146));
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar262._16_4_ = 0x3f800000;
    auVar262._20_4_ = 0x3f800000;
    auVar262._24_4_ = 0x3f800000;
    auVar262._28_4_ = 0x3f800000;
    auVar95 = vfnmadd213ps_fma(auVar101,ZEXT1632(auVar146),auVar262);
    auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar101,auVar101);
    local_a60 = vpermps_avx2(_DAT_01fb7720,local_ac0);
    auVar201 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    auVar34._4_4_ = local_a60._4_4_ * fVar157;
    auVar34._0_4_ = local_a60._0_4_ * fVar141;
    auVar34._8_4_ = local_a60._8_4_ * fVar161;
    auVar34._12_4_ = local_a60._12_4_ * fVar165;
    auVar34._16_4_ = local_a60._16_4_ * fVar276;
    auVar34._20_4_ = local_a60._20_4_ * fVar266;
    auVar34._24_4_ = local_a60._24_4_ * fVar12;
    auVar34._28_4_ = auVar101._28_4_;
    auVar92 = vfmsub231ps_fma(auVar34,auVar201,local_2e0);
    local_a80 = vpermps_avx2(_DAT_01fb7720,local_8e0);
    auVar35._4_4_ = local_a80._4_4_ * fVar159;
    auVar35._0_4_ = local_a80._0_4_ * fVar155;
    auVar35._8_4_ = local_a80._8_4_ * fVar163;
    auVar35._12_4_ = local_a80._12_4_ * fVar166;
    auVar35._16_4_ = local_a80._16_4_ * fVar277;
    auVar35._20_4_ = local_a80._20_4_ * fVar267;
    auVar35._24_4_ = local_a80._24_4_ * fVar13;
    auVar35._28_4_ = 0;
    auVar204 = vfmsub231ps_fma(auVar35,local_a60,local_300);
    auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar204._12_4_ * auVar204._12_4_,
                                                 CONCAT48(auVar204._8_4_ * auVar204._8_4_,
                                                          CONCAT44(auVar204._4_4_ * auVar204._4_4_,
                                                                   auVar204._0_4_ * auVar204._0_4_))
                                                )),ZEXT1632(auVar92),ZEXT1632(auVar92));
    auVar211._0_4_ = fVar244 * auVar201._0_4_;
    auVar211._4_4_ = fVar250 * auVar201._4_4_;
    auVar211._8_4_ = fVar251 * auVar201._8_4_;
    auVar211._12_4_ = fVar252 * auVar201._12_4_;
    auVar211._16_4_ = fVar253 * auVar201._16_4_;
    auVar211._20_4_ = fVar254 * auVar201._20_4_;
    auVar211._24_4_ = fVar255 * auVar201._24_4_;
    auVar211._28_4_ = 0;
    auVar204 = vfmsub231ps_fma(auVar211,local_a80,local_2c0);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar204),ZEXT1632(auVar204));
    auVar101 = vmaxps_avx(ZEXT1632(CONCAT412(auVar124._12_4_ * auVar95._12_4_,
                                             CONCAT48(auVar124._8_4_ * auVar95._8_4_,
                                                      CONCAT44(auVar124._4_4_ * auVar95._4_4_,
                                                               auVar124._0_4_ * auVar95._0_4_)))),
                          ZEXT1632(CONCAT412(auVar92._12_4_ * auVar95._12_4_,
                                             CONCAT48(auVar92._8_4_ * auVar95._8_4_,
                                                      CONCAT44(auVar92._4_4_ * auVar95._4_4_,
                                                               auVar92._0_4_ * auVar95._0_4_)))));
    auVar198._0_4_ = auVar97._0_4_ + fVar140;
    auVar198._4_4_ = auVar97._4_4_ + fVar154;
    auVar198._8_4_ = auVar97._8_4_ + fVar156;
    auVar198._12_4_ = auVar97._12_4_ + fVar158;
    auVar198._16_4_ = fVar160 + 0.0;
    auVar198._20_4_ = fVar162 + 0.0;
    auVar198._24_4_ = fVar164 + 0.0;
    auVar198._28_4_ = auVar227._28_4_ + 0.0;
    local_840 = ZEXT1632(auVar97);
    auVar227 = vsubps_avx(local_840,auVar31);
    auVar17 = vpermps_avx2(_DAT_01fb7720,auVar227);
    local_640 = vpermps_avx2(_DAT_01fb7720,local_840);
    auVar227 = vmaxps_avx(local_840,auVar198);
    auVar109 = vmaxps_avx(auVar17,local_640);
    auVar227 = vmaxps_avx(auVar227,auVar109);
    auVar109 = vrsqrtps_avx(ZEXT1632(auVar146));
    fVar140 = auVar109._0_4_;
    fVar164 = auVar109._4_4_;
    fVar154 = auVar109._8_4_;
    fVar156 = auVar109._12_4_;
    fVar158 = auVar109._16_4_;
    fVar160 = auVar109._20_4_;
    fVar162 = auVar109._24_4_;
    uVar85 = auVar17._28_4_;
    auVar36._4_4_ = fVar164 * fVar164 * fVar164 * auVar146._4_4_ * -0.5;
    auVar36._0_4_ = fVar140 * fVar140 * fVar140 * auVar146._0_4_ * -0.5;
    auVar36._8_4_ = fVar154 * fVar154 * fVar154 * auVar146._8_4_ * -0.5;
    auVar36._12_4_ = fVar156 * fVar156 * fVar156 * auVar146._12_4_ * -0.5;
    auVar36._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
    auVar36._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
    auVar36._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
    auVar36._28_4_ = local_a80._28_4_;
    auVar102._8_4_ = 0x3fc00000;
    auVar102._0_8_ = 0x3fc000003fc00000;
    auVar102._12_4_ = 0x3fc00000;
    auVar102._16_4_ = 0x3fc00000;
    auVar102._20_4_ = 0x3fc00000;
    auVar102._24_4_ = 0x3fc00000;
    auVar102._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_fma(auVar36,auVar102,auVar109);
    auVar243 = ZEXT1664(auVar95);
    fVar140 = auVar95._0_4_;
    fVar164 = auVar95._4_4_;
    auVar37._4_4_ = fVar250 * fVar164;
    auVar37._0_4_ = fVar244 * fVar140;
    fVar154 = auVar95._8_4_;
    auVar37._8_4_ = fVar251 * fVar154;
    fVar156 = auVar95._12_4_;
    auVar37._12_4_ = fVar252 * fVar156;
    auVar37._16_4_ = fVar253 * 0.0;
    auVar37._20_4_ = fVar254 * 0.0;
    auVar37._24_4_ = fVar255 * 0.0;
    auVar37._28_4_ = 0;
    auVar38._4_4_ = (float)local_9c0._4_4_ * fVar164 * fVar157;
    auVar38._0_4_ = (float)local_9c0._0_4_ * fVar140 * fVar141;
    auVar38._8_4_ = fStack_9b8 * fVar154 * fVar161;
    auVar38._12_4_ = fStack_9b4 * fVar156 * fVar165;
    auVar38._16_4_ = fStack_9b0 * fVar276 * 0.0;
    auVar38._20_4_ = fStack_9ac * fVar266 * 0.0;
    auVar38._24_4_ = fStack_9a8 * fVar12 * 0.0;
    auVar38._28_4_ = local_a60._28_4_;
    auVar124 = vfmadd231ps_fma(auVar38,auVar37,_local_9a0);
    local_6a0 = ZEXT1632(auVar272);
    auVar109 = vsubps_avx(ZEXT832(0) << 0x20,local_6a0);
    fVar158 = auVar109._0_4_;
    fVar160 = auVar109._4_4_;
    auVar39._4_4_ = fVar160 * fVar164 * fVar157;
    auVar39._0_4_ = fVar158 * fVar140 * fVar141;
    fVar162 = auVar109._8_4_;
    auVar39._8_4_ = fVar162 * fVar154 * fVar161;
    fVar244 = auVar109._12_4_;
    auVar39._12_4_ = fVar244 * fVar156 * fVar165;
    fVar250 = auVar109._16_4_;
    auVar39._16_4_ = fVar250 * fVar276 * 0.0;
    fVar251 = auVar109._20_4_;
    auVar39._20_4_ = fVar251 * fVar266 * 0.0;
    fVar252 = auVar109._24_4_;
    auVar39._24_4_ = fVar252 * fVar12 * 0.0;
    auVar39._28_4_ = local_300._28_4_;
    auVar109 = vsubps_avx(ZEXT832(0) << 0x20,auVar221);
    auVar146 = vfmadd231ps_fma(auVar39,auVar109,auVar37);
    auVar40._4_4_ = fVar164 * fVar159;
    auVar40._0_4_ = fVar140 * fVar155;
    auVar40._8_4_ = fVar154 * fVar163;
    auVar40._12_4_ = fVar156 * fVar166;
    auVar40._16_4_ = fVar277 * 0.0;
    auVar40._20_4_ = fVar267 * 0.0;
    auVar40._24_4_ = fVar13 * 0.0;
    auVar40._28_4_ = uVar85;
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar40,_local_6c0);
    auVar131 = ZEXT832(0) << 0x20;
    auVar14 = vsubps_avx(auVar131,auVar219);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar14,auVar40);
    local_660 = vsqrtps_avx(auVar101);
    auVar41._4_4_ = (float)local_9c0._4_4_ * fVar160;
    auVar41._0_4_ = (float)local_9c0._0_4_ * fVar158;
    auVar41._8_4_ = fStack_9b8 * fVar162;
    auVar41._12_4_ = fStack_9b4 * fVar244;
    auVar41._16_4_ = fStack_9b0 * fVar250;
    auVar41._20_4_ = fStack_9ac * fVar251;
    auVar41._24_4_ = fStack_9a8 * fVar252;
    auVar41._28_4_ = auVar101._28_4_;
    auVar92 = vfmadd231ps_fma(auVar41,_local_9a0,auVar109);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),_local_6c0,auVar14);
    fVar141 = auVar146._0_4_;
    fVar276 = auVar124._0_4_;
    fVar155 = auVar146._4_4_;
    fVar277 = auVar124._4_4_;
    fVar157 = auVar146._8_4_;
    fVar266 = auVar124._8_4_;
    fVar159 = auVar146._12_4_;
    fVar267 = auVar124._12_4_;
    auVar42._28_4_ = uVar85;
    auVar42._0_28_ =
         ZEXT1628(CONCAT412(fVar267 * fVar159,
                            CONCAT48(fVar266 * fVar157,CONCAT44(fVar277 * fVar155,fVar276 * fVar141)
                                    )));
    auVar101 = vsubps_avx(ZEXT1632(auVar92),auVar42);
    auVar43._4_4_ = fVar160 * fVar160;
    auVar43._0_4_ = fVar158 * fVar158;
    auVar43._8_4_ = fVar162 * fVar162;
    auVar43._12_4_ = fVar244 * fVar244;
    auVar43._16_4_ = fVar250 * fVar250;
    auVar43._20_4_ = fVar251 * fVar251;
    auVar43._24_4_ = fVar252 * fVar252;
    auVar43._28_4_ = uVar85;
    auVar92 = vfmadd231ps_fma(auVar43,auVar109,auVar109);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar14,auVar14);
    auVar44._28_4_ = uStack_9a4;
    auVar44._0_28_ =
         ZEXT1628(CONCAT412(fVar159 * fVar159,
                            CONCAT48(fVar157 * fVar157,CONCAT44(fVar155 * fVar155,fVar141 * fVar141)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar92),auVar44);
    fVar166 = local_660._28_4_ + auVar227._28_4_;
    fVar141 = (local_660._0_4_ + auVar227._0_4_) * 1.0000002;
    fVar155 = (local_660._4_4_ + auVar227._4_4_) * 1.0000002;
    fVar157 = (local_660._8_4_ + auVar227._8_4_) * 1.0000002;
    fVar159 = (local_660._12_4_ + auVar227._12_4_) * 1.0000002;
    fVar161 = (local_660._16_4_ + auVar227._16_4_) * 1.0000002;
    fVar163 = (local_660._20_4_ + auVar227._20_4_) * 1.0000002;
    fVar165 = (local_660._24_4_ + auVar227._24_4_) * 1.0000002;
    auVar45._4_4_ = fVar155 * fVar155;
    auVar45._0_4_ = fVar141 * fVar141;
    auVar45._8_4_ = fVar157 * fVar157;
    auVar45._12_4_ = fVar159 * fVar159;
    auVar45._16_4_ = fVar161 * fVar161;
    auVar45._20_4_ = fVar163 * fVar163;
    auVar45._24_4_ = fVar165 * fVar165;
    auVar45._28_4_ = fVar166;
    fVar141 = auVar101._0_4_ + auVar101._0_4_;
    fVar155 = auVar101._4_4_ + auVar101._4_4_;
    local_320._0_8_ = CONCAT44(fVar155,fVar141);
    local_320._8_4_ = auVar101._8_4_ + auVar101._8_4_;
    local_320._12_4_ = auVar101._12_4_ + auVar101._12_4_;
    local_320._16_4_ = auVar101._16_4_ + auVar101._16_4_;
    local_320._20_4_ = auVar101._20_4_ + auVar101._20_4_;
    local_320._24_4_ = auVar101._24_4_ + auVar101._24_4_;
    local_320._28_4_ = auVar101._28_4_ + auVar101._28_4_;
    auVar227 = vsubps_avx(auVar15,auVar45);
    local_a00 = ZEXT1632(auVar124);
    auVar46._28_4_ = auVar15._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar267 * fVar267,
                            CONCAT48(fVar266 * fVar266,CONCAT44(fVar277 * fVar277,fVar276 * fVar276)
                                    )));
    auVar185 = vsubps_avx(local_280,auVar46);
    auVar47._4_4_ = fVar155 * fVar155;
    auVar47._0_4_ = fVar141 * fVar141;
    auVar47._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar47._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar47._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar47._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar47._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar47._28_4_ = local_660._28_4_;
    fVar157 = auVar185._0_4_;
    local_680._0_4_ = fVar157 * 4.0;
    fVar159 = auVar185._4_4_;
    local_680._4_4_ = fVar159 * 4.0;
    fVar161 = auVar185._8_4_;
    fStack_678 = fVar161 * 4.0;
    fVar163 = auVar185._12_4_;
    fStack_674 = fVar163 * 4.0;
    fVar165 = auVar185._16_4_;
    fStack_670 = fVar165 * 4.0;
    fVar276 = auVar185._20_4_;
    fStack_66c = fVar276 * 4.0;
    fVar277 = auVar185._24_4_;
    fStack_668 = fVar277 * 4.0;
    uStack_664 = 0x40800000;
    auVar48._4_4_ = auVar227._4_4_ * (float)local_680._4_4_;
    auVar48._0_4_ = auVar227._0_4_ * (float)local_680._0_4_;
    auVar48._8_4_ = auVar227._8_4_ * fStack_678;
    auVar48._12_4_ = auVar227._12_4_ * fStack_674;
    auVar48._16_4_ = auVar227._16_4_ * fStack_670;
    auVar48._20_4_ = auVar227._20_4_ * fStack_66c;
    auVar48._24_4_ = auVar227._24_4_ * fStack_668;
    auVar48._28_4_ = fVar166;
    auVar16 = vsubps_avx(auVar47,auVar48);
    auVar101 = vcmpps_avx(auVar16,auVar131,5);
    local_420 = vandps_avx(auVar46,local_6e0);
    local_340._0_4_ = fVar157 + fVar157;
    local_340._4_4_ = fVar159 + fVar159;
    local_340._8_4_ = fVar161 + fVar161;
    local_340._12_4_ = fVar163 + fVar163;
    local_340._16_4_ = fVar165 + fVar165;
    local_340._20_4_ = fVar276 + fVar276;
    local_340._24_4_ = fVar277 + fVar277;
    local_340._28_4_ = auVar185._28_4_ + auVar185._28_4_;
    local_440 = vandps_avx(auVar185,local_6e0);
    local_aa0 = -0.0;
    fStack_a9c = -0.0;
    fStack_a98 = -0.0;
    fStack_a94 = -0.0;
    uStack_a90 = 0x80000000;
    uStack_a8c = 0x80000000;
    uStack_a88 = 0x80000000;
    uStack_a84 = 0x80000000;
    local_460 = ZEXT1632(auVar146);
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar263._8_4_ = 0x7f800000;
      auVar263._0_8_ = 0x7f8000007f800000;
      auVar263._12_4_ = 0x7f800000;
      auVar263._16_4_ = 0x7f800000;
      auVar263._20_4_ = 0x7f800000;
      auVar263._24_4_ = 0x7f800000;
      auVar263._28_4_ = 0x7f800000;
      auVar265 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar148 = vsqrtps_avx(auVar16);
      auVar185 = vrcpps_avx(local_340);
      auVar16 = vcmpps_avx(auVar16,auVar131,5);
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = 0x3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      auVar124 = vfnmadd213ps_fma(auVar185,local_340,auVar229);
      auVar124 = vfmadd132ps_fma(ZEXT1632(auVar124),auVar185,auVar185);
      auVar103._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
      auVar103._8_4_ = -local_320._8_4_;
      auVar103._12_4_ = -local_320._12_4_;
      auVar103._16_4_ = -local_320._16_4_;
      auVar103._20_4_ = -local_320._20_4_;
      auVar103._24_4_ = -local_320._24_4_;
      auVar103._28_4_ = -local_320._28_4_;
      auVar185 = vsubps_avx(auVar103,auVar148);
      auVar49._4_4_ = auVar185._4_4_ * auVar124._4_4_;
      auVar49._0_4_ = auVar185._0_4_ * auVar124._0_4_;
      auVar49._8_4_ = auVar185._8_4_ * auVar124._8_4_;
      auVar49._12_4_ = auVar185._12_4_ * auVar124._12_4_;
      auVar49._16_4_ = auVar185._16_4_ * 0.0;
      auVar49._20_4_ = auVar185._20_4_ * 0.0;
      auVar49._24_4_ = auVar185._24_4_ * 0.0;
      auVar49._28_4_ = auVar185._28_4_;
      auVar185 = vsubps_avx(auVar148,local_320);
      auVar212._0_4_ = auVar185._0_4_ * auVar124._0_4_;
      auVar212._4_4_ = auVar185._4_4_ * auVar124._4_4_;
      auVar212._8_4_ = auVar185._8_4_ * auVar124._8_4_;
      auVar212._12_4_ = auVar185._12_4_ * auVar124._12_4_;
      auVar212._16_4_ = auVar185._16_4_ * 0.0;
      auVar212._20_4_ = auVar185._20_4_ * 0.0;
      auVar212._24_4_ = auVar185._24_4_ * 0.0;
      auVar212._28_4_ = 0;
      auVar124 = vfmadd213ps_fma(local_a00,auVar49,local_460);
      local_400 = fVar140 * auVar124._0_4_;
      fStack_3fc = fVar164 * auVar124._4_4_;
      fStack_3f8 = fVar154 * auVar124._8_4_;
      fStack_3f4 = fVar156 * auVar124._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      fStack_3e4 = local_340._28_4_;
      auVar124 = vfmadd213ps_fma(local_a00,auVar212,local_460);
      local_3e0 = fVar140 * auVar124._0_4_;
      fStack_3dc = fVar164 * auVar124._4_4_;
      fStack_3d8 = fVar154 * auVar124._8_4_;
      fStack_3d4 = fVar156 * auVar124._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      fStack_3c4 = local_340._28_4_;
      auVar230._8_4_ = 0x7f800000;
      auVar230._0_8_ = 0x7f8000007f800000;
      auVar230._12_4_ = 0x7f800000;
      auVar230._16_4_ = 0x7f800000;
      auVar230._20_4_ = 0x7f800000;
      auVar230._24_4_ = 0x7f800000;
      auVar230._28_4_ = 0x7f800000;
      auVar263 = vblendvps_avx(auVar230,auVar49,auVar16);
      auVar104._8_4_ = 0xff800000;
      auVar104._0_8_ = 0xff800000ff800000;
      auVar104._12_4_ = 0xff800000;
      auVar104._16_4_ = 0xff800000;
      auVar104._20_4_ = 0xff800000;
      auVar104._24_4_ = 0xff800000;
      auVar104._28_4_ = 0xff800000;
      auVar185 = vblendvps_avx(auVar104,auVar212,auVar16);
      auVar265 = ZEXT3264(auVar185);
      auVar131 = vmaxps_avx(local_600,local_420);
      auVar50._4_4_ = auVar131._4_4_ * 1.9073486e-06;
      auVar50._0_4_ = auVar131._0_4_ * 1.9073486e-06;
      auVar50._8_4_ = auVar131._8_4_ * 1.9073486e-06;
      auVar50._12_4_ = auVar131._12_4_ * 1.9073486e-06;
      auVar50._16_4_ = auVar131._16_4_ * 1.9073486e-06;
      auVar50._20_4_ = auVar131._20_4_ * 1.9073486e-06;
      auVar50._24_4_ = auVar131._24_4_ * 1.9073486e-06;
      auVar50._28_4_ = auVar131._28_4_;
      auVar131 = vcmpps_avx(local_440,auVar50,1);
      auVar148 = auVar16 & auVar131;
      if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar148 >> 0x7f,0) == '\0') &&
            (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar148 >> 0xbf,0) == '\0') &&
          (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar148[0x1f]) {
        auVar243 = ZEXT3264(ZEXT1632(auVar95));
      }
      else {
        auVar101 = vandps_avx(auVar131,auVar16);
        auVar131 = vcmpps_avx(auVar227,_DAT_01f7b000,2);
        auVar248._8_4_ = 0xff800000;
        auVar248._0_8_ = 0xff800000ff800000;
        auVar248._12_4_ = 0xff800000;
        auVar248._16_4_ = 0xff800000;
        auVar248._20_4_ = 0xff800000;
        auVar248._24_4_ = 0xff800000;
        auVar248._28_4_ = 0xff800000;
        auVar233._8_4_ = 0x7f800000;
        auVar233._0_8_ = 0x7f8000007f800000;
        auVar233._12_4_ = 0x7f800000;
        auVar233._16_4_ = 0x7f800000;
        auVar233._20_4_ = 0x7f800000;
        auVar233._24_4_ = 0x7f800000;
        auVar233._28_4_ = 0x7f800000;
        auVar227 = vblendvps_avx(auVar233,auVar248,auVar131);
        auVar124 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar148 = vpmovsxwd_avx2(auVar124);
        auVar263 = vblendvps_avx(auVar263,auVar227,auVar148);
        auVar227 = vblendvps_avx(auVar248,auVar233,auVar131);
        auVar227 = vblendvps_avx(auVar185,auVar227,auVar148);
        auVar265 = ZEXT3264(auVar227);
        auVar114._0_8_ = auVar101._0_8_ ^ 0xffffffffffffffff;
        auVar114._8_4_ = auVar101._8_4_ ^ 0xffffffff;
        auVar114._12_4_ = auVar101._12_4_ ^ 0xffffffff;
        auVar114._16_4_ = auVar101._16_4_ ^ 0xffffffff;
        auVar114._20_4_ = auVar101._20_4_ ^ 0xffffffff;
        auVar114._24_4_ = auVar101._24_4_ ^ 0xffffffff;
        auVar114._28_4_ = auVar101._28_4_ ^ 0xffffffff;
        auVar101 = vorps_avx(auVar131,auVar114);
        auVar101 = vandps_avx(auVar16,auVar101);
        auVar243 = ZEXT3264(ZEXT1632(auVar95));
      }
    }
    auVar227 = local_560 & auVar101;
    auVar249 = ZEXT3264(local_a00);
    if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar227 >> 0x7f,0) == '\0') &&
          (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar227 >> 0xbf,0) == '\0') &&
        (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar227[0x1f])
    {
LAB_012c244b:
      auVar271 = ZEXT3264(local_a20);
      auVar265 = ZEXT3264(local_a40);
      fVar141 = (float)local_900._0_4_;
      fVar155 = (float)local_900._4_4_;
      fVar140 = fStack_8f8;
      fVar157 = fStack_8f4;
      fVar159 = fStack_8f0;
      fVar164 = fStack_8ec;
      fVar161 = fStack_8e8;
      fVar163 = fStack_8e4;
    }
    else {
      auVar240 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar140 = *(float *)(ray + k * 4 + 0x80) - (float)local_970._0_4_;
      auVar105._4_4_ = fVar140;
      auVar105._0_4_ = fVar140;
      auVar105._8_4_ = fVar140;
      auVar105._12_4_ = fVar140;
      auVar105._16_4_ = fVar140;
      auVar105._20_4_ = fVar140;
      auVar105._24_4_ = fVar140;
      auVar105._28_4_ = fVar140;
      auVar16 = vminps_avx(auVar105,auVar265._0_32_);
      auVar215._0_4_ = fVar158 * local_7e0._0_4_;
      auVar215._4_4_ = fVar160 * local_7e0._4_4_;
      auVar215._8_4_ = fVar162 * local_7e0._8_4_;
      auVar215._12_4_ = fVar244 * local_7e0._12_4_;
      auVar215._16_4_ = fVar250 * local_7e0._16_4_;
      auVar215._20_4_ = fVar251 * local_7e0._20_4_;
      auVar215._28_36_ = auVar265._28_36_;
      auVar215._24_4_ = fVar252 * local_7e0._24_4_;
      auVar95 = vfmadd213ps_fma(auVar109,local_8e0,auVar215._0_32_);
      auVar75._4_4_ = fStack_39c;
      auVar75._0_4_ = local_3a0;
      auVar75._8_4_ = fStack_398;
      auVar75._12_4_ = fStack_394;
      auVar75._16_4_ = fStack_390;
      auVar75._20_4_ = fStack_38c;
      auVar75._24_4_ = fStack_388;
      auVar75._28_4_ = fStack_384;
      auVar185 = vmaxps_avx(auVar75,auVar263);
      auVar124 = vfmadd213ps_fma(auVar14,local_ac0,ZEXT1632(auVar95));
      auVar199._0_4_ = (float)local_9c0._0_4_ * local_7e0._0_4_;
      auVar199._4_4_ = (float)local_9c0._4_4_ * local_7e0._4_4_;
      auVar199._8_4_ = fStack_9b8 * local_7e0._8_4_;
      auVar199._12_4_ = fStack_9b4 * local_7e0._12_4_;
      auVar199._16_4_ = fStack_9b0 * local_7e0._16_4_;
      auVar199._20_4_ = fStack_9ac * local_7e0._20_4_;
      auVar199._24_4_ = fStack_9a8 * local_7e0._24_4_;
      auVar199._28_4_ = 0;
      auVar95 = vfmadd231ps_fma(auVar199,_local_9a0,local_8e0);
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar95),_local_6c0,local_ac0);
      auVar227 = vandps_avx(local_6e0,ZEXT1632(auVar146));
      auVar264._8_4_ = 0x219392ef;
      auVar264._0_8_ = 0x219392ef219392ef;
      auVar264._12_4_ = 0x219392ef;
      auVar264._16_4_ = 0x219392ef;
      auVar264._20_4_ = 0x219392ef;
      auVar264._24_4_ = 0x219392ef;
      auVar264._28_4_ = 0x219392ef;
      auVar109 = vcmpps_avx(auVar227,auVar264,1);
      auVar227 = vrcpps_avx(ZEXT1632(auVar146));
      auVar268._8_4_ = 0x3f800000;
      auVar268._0_8_ = 0x3f8000003f800000;
      auVar268._12_4_ = 0x3f800000;
      auVar268._16_4_ = 0x3f800000;
      auVar268._20_4_ = 0x3f800000;
      auVar268._24_4_ = 0x3f800000;
      auVar268._28_4_ = 0x3f800000;
      auVar131 = ZEXT1632(auVar146);
      auVar95 = vfnmadd213ps_fma(auVar227,auVar131,auVar268);
      auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar227,auVar227);
      auVar269._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
      auVar269._8_4_ = auVar146._8_4_ ^ 0x80000000;
      auVar269._12_4_ = auVar146._12_4_ ^ 0x80000000;
      auVar269._16_4_ = 0x80000000;
      auVar269._20_4_ = 0x80000000;
      auVar269._24_4_ = 0x80000000;
      auVar269._28_4_ = 0x80000000;
      auVar51._4_4_ = auVar95._4_4_ * -auVar124._4_4_;
      auVar51._0_4_ = auVar95._0_4_ * -auVar124._0_4_;
      auVar51._8_4_ = auVar95._8_4_ * -auVar124._8_4_;
      auVar51._12_4_ = auVar95._12_4_ * -auVar124._12_4_;
      auVar51._16_4_ = 0x80000000;
      auVar51._20_4_ = 0x80000000;
      auVar51._24_4_ = 0x80000000;
      auVar51._28_4_ = 0x80000000;
      auVar227 = vcmpps_avx(auVar131,auVar269,1);
      auVar227 = vorps_avx(auVar109,auVar227);
      auVar231._8_4_ = 0xff800000;
      auVar231._0_8_ = 0xff800000ff800000;
      auVar231._12_4_ = 0xff800000;
      auVar231._16_4_ = 0xff800000;
      auVar231._20_4_ = 0xff800000;
      auVar231._24_4_ = 0xff800000;
      auVar231._28_4_ = 0xff800000;
      auVar227 = vblendvps_avx(auVar51,auVar231,auVar227);
      auVar14 = vmaxps_avx(auVar185,auVar227);
      auVar227 = vcmpps_avx(auVar131,auVar269,6);
      auVar227 = vorps_avx(auVar109,auVar227);
      auVar270._8_4_ = 0x7f800000;
      auVar270._0_8_ = 0x7f8000007f800000;
      auVar270._12_4_ = 0x7f800000;
      auVar270._16_4_ = 0x7f800000;
      auVar270._20_4_ = 0x7f800000;
      auVar270._24_4_ = 0x7f800000;
      auVar270._28_4_ = 0x7f800000;
      auVar227 = vblendvps_avx(auVar51,auVar270,auVar227);
      auVar185 = vminps_avx(auVar16,auVar227);
      uStack_bc4 = auVar201._28_4_;
      fVar140 = -auVar201._0_4_;
      fVar157 = -auVar201._4_4_;
      fVar159 = -auVar201._8_4_;
      fVar164 = -auVar201._12_4_;
      fVar161 = -auVar201._16_4_;
      fVar163 = -auVar201._20_4_;
      fVar154 = -auVar201._24_4_;
      auVar200._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
      auVar200._8_4_ = -local_a80._8_4_;
      auVar200._12_4_ = -local_a80._12_4_;
      auVar200._16_4_ = -local_a80._16_4_;
      auVar200._20_4_ = -local_a80._20_4_;
      auVar200._24_4_ = -local_a80._24_4_;
      auVar200._28_4_ = local_a80._28_4_ ^ 0x80000000;
      auVar227 = vsubps_avx(ZEXT832(0) << 0x20,local_7c0);
      auVar109 = vsubps_avx(ZEXT832(0) << 0x20,local_b20);
      auVar52._4_4_ = auVar109._4_4_ * fVar157;
      auVar52._0_4_ = auVar109._0_4_ * fVar140;
      auVar52._8_4_ = auVar109._8_4_ * fVar159;
      auVar52._12_4_ = auVar109._12_4_ * fVar164;
      auVar52._16_4_ = auVar109._16_4_ * fVar161;
      auVar52._20_4_ = auVar109._20_4_ * fVar163;
      auVar52._24_4_ = auVar109._24_4_ * fVar154;
      auVar52._28_4_ = auVar109._28_4_;
      auVar95 = vfmadd231ps_fma(auVar52,auVar200,auVar227);
      auVar213._0_8_ = local_a60._0_8_ ^ 0x8000000080000000;
      auVar213._8_4_ = -local_a60._8_4_;
      auVar213._12_4_ = -local_a60._12_4_;
      auVar213._16_4_ = -local_a60._16_4_;
      auVar213._20_4_ = -local_a60._20_4_;
      auVar213._24_4_ = -local_a60._24_4_;
      auVar213._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar227 = vsubps_avx(ZEXT832(0) << 0x20,local_b00);
      auVar124 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar213,auVar227);
      auVar53._4_4_ = fVar157 * (float)local_9c0._4_4_;
      auVar53._0_4_ = fVar140 * (float)local_9c0._0_4_;
      auVar53._8_4_ = fVar159 * fStack_9b8;
      auVar53._12_4_ = fVar164 * fStack_9b4;
      auVar53._16_4_ = fVar161 * fStack_9b0;
      auVar53._20_4_ = fVar163 * fStack_9ac;
      auVar53._24_4_ = fVar154 * fStack_9a8;
      auVar53._28_4_ = uStack_bc4 ^ 0x80000000;
      auVar95 = vfmadd231ps_fma(auVar53,auVar200,_local_9a0);
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar95),_local_6c0,auVar213);
      auVar227 = vandps_avx(local_6e0,ZEXT1632(auVar146));
      auVar201 = vrcpps_avx(ZEXT1632(auVar146));
      auVar109 = vcmpps_avx(auVar227,auVar264,1);
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = 0x3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar106._16_4_ = 0x3f800000;
      auVar106._20_4_ = 0x3f800000;
      auVar106._24_4_ = 0x3f800000;
      auVar106._28_4_ = 0x3f800000;
      auVar131 = ZEXT1632(auVar146);
      auVar95 = vfnmadd213ps_fma(auVar201,auVar131,auVar106);
      auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar201,auVar201);
      auVar214._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
      auVar214._8_4_ = auVar146._8_4_ ^ 0x80000000;
      auVar214._12_4_ = auVar146._12_4_ ^ 0x80000000;
      auVar214._16_4_ = 0x80000000;
      auVar214._20_4_ = 0x80000000;
      auVar214._24_4_ = 0x80000000;
      auVar214._28_4_ = 0x80000000;
      auVar54._4_4_ = auVar95._4_4_ * -auVar124._4_4_;
      auVar54._0_4_ = auVar95._0_4_ * -auVar124._0_4_;
      auVar54._8_4_ = auVar95._8_4_ * -auVar124._8_4_;
      auVar54._12_4_ = auVar95._12_4_ * -auVar124._12_4_;
      auVar54._16_4_ = 0x80000000;
      auVar54._20_4_ = 0x80000000;
      auVar54._24_4_ = 0x80000000;
      auVar54._28_4_ = 0x80000000;
      auVar227 = vcmpps_avx(auVar131,auVar214,1);
      auVar227 = vorps_avx(auVar227,auVar109);
      auVar107._8_4_ = 0xff800000;
      auVar107._0_8_ = 0xff800000ff800000;
      auVar107._12_4_ = 0xff800000;
      auVar107._16_4_ = 0xff800000;
      auVar107._20_4_ = 0xff800000;
      auVar107._24_4_ = 0xff800000;
      auVar107._28_4_ = 0xff800000;
      auVar227 = vblendvps_avx(auVar54,auVar107,auVar227);
      local_920 = vmaxps_avx(auVar14,auVar227);
      auVar227 = vcmpps_avx(auVar131,auVar214,6);
      auVar227 = vorps_avx(auVar109,auVar227);
      auVar227 = vblendvps_avx(auVar54,auVar270,auVar227);
      auVar101 = vandps_avx(auVar101,local_560);
      local_480 = vminps_avx(auVar185,auVar227);
      auVar227 = vcmpps_avx(local_920,local_480,2);
      auVar109 = auVar101 & auVar227;
      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar109 >> 0x7f,0) == '\0') &&
            (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar109 >> 0xbf,0) == '\0') &&
          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar109[0x1f]) goto LAB_012c244b;
      auVar73._4_4_ = fStack_3fc;
      auVar73._0_4_ = local_400;
      auVar73._8_4_ = fStack_3f8;
      auVar73._12_4_ = fStack_3f4;
      auVar73._16_4_ = uStack_3f0;
      auVar73._20_4_ = uStack_3ec;
      auVar73._24_4_ = uStack_3e8;
      auVar73._28_4_ = fStack_3e4;
      auVar220._8_4_ = 0x3f800000;
      auVar220._0_8_ = 0x3f8000003f800000;
      auVar220._12_4_ = 0x3f800000;
      auVar220._16_4_ = 0x3f800000;
      auVar220._20_4_ = 0x3f800000;
      auVar220._24_4_ = 0x3f800000;
      auVar220._28_4_ = 0x3f800000;
      auVar109 = vminps_avx(auVar73,auVar220);
      auVar185 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar109 = vmaxps_avx(auVar109,ZEXT832(0) << 0x20);
      auVar74._4_4_ = fStack_3dc;
      auVar74._0_4_ = local_3e0;
      auVar74._8_4_ = fStack_3d8;
      auVar74._12_4_ = fStack_3d4;
      auVar74._16_4_ = uStack_3d0;
      auVar74._20_4_ = uStack_3cc;
      auVar74._24_4_ = uStack_3c8;
      auVar74._28_4_ = fStack_3c4;
      auVar14 = vminps_avx(auVar74,auVar220);
      auVar14 = vmaxps_avx(auVar14,ZEXT832(0) << 0x20);
      auVar55._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar109._28_4_ + 7.0;
      auVar95 = vfmadd213ps_fma(auVar55,local_820,local_800);
      auVar56._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar14._28_4_ + 7.0;
      auVar124 = vfmadd213ps_fma(auVar56,local_820,local_800);
      auVar109 = vminps_avx(local_840,auVar198);
      auVar14 = vminps_avx(auVar17,local_640);
      auVar109 = vminps_avx(auVar109,auVar14);
      auVar109 = vsubps_avx(auVar109,local_660);
      auVar101 = vandps_avx(auVar227,auVar101);
      local_1a0 = ZEXT1632(auVar95);
      local_1c0 = ZEXT1632(auVar124);
      auVar57._4_4_ = auVar109._4_4_ * 0.99999976;
      auVar57._0_4_ = auVar109._0_4_ * 0.99999976;
      auVar57._8_4_ = auVar109._8_4_ * 0.99999976;
      auVar57._12_4_ = auVar109._12_4_ * 0.99999976;
      auVar57._16_4_ = auVar109._16_4_ * 0.99999976;
      auVar57._20_4_ = auVar109._20_4_ * 0.99999976;
      auVar57._24_4_ = auVar109._24_4_ * 0.99999976;
      auVar57._28_4_ = 0x3f7ffffc;
      auVar227 = vmaxps_avx(ZEXT832(0) << 0x20,auVar57);
      auVar58._4_4_ = auVar227._4_4_ * auVar227._4_4_;
      auVar58._0_4_ = auVar227._0_4_ * auVar227._0_4_;
      auVar58._8_4_ = auVar227._8_4_ * auVar227._8_4_;
      auVar58._12_4_ = auVar227._12_4_ * auVar227._12_4_;
      auVar58._16_4_ = auVar227._16_4_ * auVar227._16_4_;
      auVar58._20_4_ = auVar227._20_4_ * auVar227._20_4_;
      auVar58._24_4_ = auVar227._24_4_ * auVar227._24_4_;
      auVar58._28_4_ = auVar227._28_4_;
      auVar109 = vsubps_avx(auVar15,auVar58);
      auVar59._4_4_ = auVar109._4_4_ * (float)local_680._4_4_;
      auVar59._0_4_ = auVar109._0_4_ * (float)local_680._0_4_;
      auVar59._8_4_ = auVar109._8_4_ * fStack_678;
      auVar59._12_4_ = auVar109._12_4_ * fStack_674;
      auVar59._16_4_ = auVar109._16_4_ * fStack_670;
      auVar59._20_4_ = auVar109._20_4_ * fStack_66c;
      auVar59._24_4_ = auVar109._24_4_ * fStack_668;
      auVar59._28_4_ = auVar227._28_4_;
      auVar14 = vsubps_avx(auVar47,auVar59);
      _local_b40 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
      auVar227 = _local_b40;
      if ((((((((_local_b40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (_local_b40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (_local_b40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(_local_b40 >> 0x7f,0) == '\0') &&
            (_local_b40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(_local_b40 >> 0xbf,0) == '\0') &&
          (_local_b40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_b40[0x1f]) {
        auVar221 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar259 = ZEXT828(0) << 0x20;
        auVar243 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar201 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c60 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar232._8_4_ = 0x7f800000;
        auVar232._0_8_ = 0x7f8000007f800000;
        auVar232._12_4_ = 0x7f800000;
        auVar232._16_4_ = 0x7f800000;
        auVar232._20_4_ = 0x7f800000;
        auVar232._24_4_ = 0x7f800000;
        auVar232._28_4_ = 0x7f800000;
        auVar247._8_4_ = 0xff800000;
        auVar247._0_8_ = 0xff800000ff800000;
        auVar247._12_4_ = 0xff800000;
        auVar247._16_4_ = 0xff800000;
        auVar247._20_4_ = 0xff800000;
        auVar247._24_4_ = 0xff800000;
        auVar247._28_4_ = 0xff800000;
        _local_b40 = auVar16;
      }
      else {
        auVar15 = vrcpps_avx(local_340);
        auVar202._8_4_ = 0x3f800000;
        auVar202._0_8_ = 0x3f8000003f800000;
        auVar202._12_4_ = 0x3f800000;
        auVar202._16_4_ = 0x3f800000;
        auVar202._20_4_ = 0x3f800000;
        auVar202._24_4_ = 0x3f800000;
        auVar202._28_4_ = 0x3f800000;
        auVar95 = vfnmadd213ps_fma(local_340,auVar15,auVar202);
        auVar185 = vsqrtps_avx(auVar14);
        auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar15,auVar15);
        auVar186._0_8_ = CONCAT44(fVar155,fVar141) ^ 0x8000000080000000;
        auVar186._8_4_ = -local_320._8_4_;
        auVar186._12_4_ = -local_320._12_4_;
        auVar186._16_4_ = -local_320._16_4_;
        auVar186._20_4_ = -local_320._20_4_;
        auVar186._24_4_ = -local_320._24_4_;
        auVar186._28_4_ = -local_320._28_4_;
        auVar15 = vsubps_avx(auVar186,auVar185);
        auVar185 = vsubps_avx(auVar185,local_320);
        fVar141 = auVar15._0_4_ * auVar95._0_4_;
        fVar155 = auVar15._4_4_ * auVar95._4_4_;
        auVar60._4_4_ = fVar155;
        auVar60._0_4_ = fVar141;
        fVar140 = auVar15._8_4_ * auVar95._8_4_;
        auVar60._8_4_ = fVar140;
        fVar157 = auVar15._12_4_ * auVar95._12_4_;
        auVar60._12_4_ = fVar157;
        fVar159 = auVar15._16_4_ * 0.0;
        auVar60._16_4_ = fVar159;
        fVar164 = auVar15._20_4_ * 0.0;
        auVar60._20_4_ = fVar164;
        fVar161 = auVar15._24_4_ * 0.0;
        auVar60._24_4_ = fVar161;
        auVar60._28_4_ = local_320._28_4_;
        fVar163 = auVar185._0_4_ * auVar95._0_4_;
        fVar154 = auVar185._4_4_ * auVar95._4_4_;
        auVar61._4_4_ = fVar154;
        auVar61._0_4_ = fVar163;
        fVar165 = auVar185._8_4_ * auVar95._8_4_;
        auVar61._8_4_ = fVar165;
        fVar166 = auVar185._12_4_ * auVar95._12_4_;
        auVar61._12_4_ = fVar166;
        fVar156 = auVar185._16_4_ * 0.0;
        auVar61._16_4_ = fVar156;
        fVar276 = auVar185._20_4_ * 0.0;
        auVar61._20_4_ = fVar276;
        fVar277 = auVar185._24_4_ * 0.0;
        auVar61._24_4_ = fVar277;
        auVar61._28_4_ = 0x80000000;
        auVar95 = vfmadd213ps_fma(local_a00,auVar60,local_460);
        auVar124 = vfmadd213ps_fma(local_a00,auVar61,local_460);
        auVar187._0_4_ = auVar243._0_4_ * auVar95._0_4_;
        auVar187._4_4_ = auVar243._4_4_ * auVar95._4_4_;
        auVar187._8_4_ = auVar243._8_4_ * auVar95._8_4_;
        auVar187._12_4_ = auVar243._12_4_ * auVar95._12_4_;
        auVar187._16_4_ = auVar243._16_4_ * 0.0;
        auVar187._20_4_ = auVar243._20_4_ * 0.0;
        auVar187._24_4_ = auVar243._24_4_ * 0.0;
        auVar187._28_4_ = 0;
        auVar62._4_4_ = auVar243._4_4_ * auVar124._4_4_;
        auVar62._0_4_ = auVar243._0_4_ * auVar124._0_4_;
        auVar62._8_4_ = auVar243._8_4_ * auVar124._8_4_;
        auVar62._12_4_ = auVar243._12_4_ * auVar124._12_4_;
        auVar62._16_4_ = auVar243._16_4_ * 0.0;
        auVar62._20_4_ = auVar243._20_4_ * 0.0;
        auVar62._24_4_ = auVar243._24_4_ * 0.0;
        auVar62._28_4_ = 0;
        auVar95 = vfmadd213ps_fma(local_2e0,auVar187,auVar219);
        auVar124 = vfmadd213ps_fma(local_2e0,auVar62,auVar219);
        auVar146 = vfmadd213ps_fma(local_300,auVar187,auVar221);
        auVar92 = vfmadd213ps_fma(local_300,auVar62,auVar221);
        auVar204 = vfmadd213ps_fma(auVar187,local_2c0,local_6a0);
        auVar205 = vfmadd213ps_fma(local_2c0,auVar62,local_6a0);
        auVar63._4_4_ = (float)local_6c0._4_4_ * fVar155;
        auVar63._0_4_ = (float)local_6c0._0_4_ * fVar141;
        auVar63._8_4_ = fStack_6b8 * fVar140;
        auVar63._12_4_ = fStack_6b4 * fVar157;
        auVar63._16_4_ = fStack_6b0 * fVar159;
        auVar63._20_4_ = fStack_6ac * fVar164;
        auVar63._24_4_ = fStack_6a8 * fVar161;
        auVar63._28_4_ = 0;
        auVar16 = vsubps_avx(auVar63,ZEXT1632(auVar95));
        auVar222._0_4_ = (float)local_9a0._0_4_ * fVar141;
        auVar222._4_4_ = (float)local_9a0._4_4_ * fVar155;
        auVar222._8_4_ = fStack_998 * fVar140;
        auVar222._12_4_ = fStack_994 * fVar157;
        auVar222._16_4_ = fStack_990 * fVar159;
        auVar222._20_4_ = fStack_98c * fVar164;
        auVar222._24_4_ = fStack_988 * fVar161;
        auVar222._28_4_ = 0;
        auVar201 = vsubps_avx(auVar222,ZEXT1632(auVar146));
        auVar64._4_4_ = (float)local_9c0._4_4_ * fVar155;
        auVar64._0_4_ = (float)local_9c0._0_4_ * fVar141;
        auVar64._8_4_ = fStack_9b8 * fVar140;
        auVar64._12_4_ = fStack_9b4 * fVar157;
        auVar64._16_4_ = fStack_9b0 * fVar159;
        auVar64._20_4_ = fStack_9ac * fVar164;
        auVar64._24_4_ = fStack_9a8 * fVar161;
        auVar64._28_4_ = 0;
        auVar15 = vsubps_avx(auVar64,ZEXT1632(auVar204));
        _local_c60 = auVar15._0_28_;
        auVar65._4_4_ = fVar154 * (float)local_6c0._4_4_;
        auVar65._0_4_ = fVar163 * (float)local_6c0._0_4_;
        auVar65._8_4_ = fVar165 * fStack_6b8;
        auVar65._12_4_ = fVar166 * fStack_6b4;
        auVar65._16_4_ = fVar156 * fStack_6b0;
        auVar65._20_4_ = fVar276 * fStack_6ac;
        auVar65._24_4_ = fVar277 * fStack_6a8;
        auVar65._28_4_ = auVar15._28_4_;
        auVar185 = vsubps_avx(auVar65,ZEXT1632(auVar124));
        auVar66._4_4_ = (float)local_9a0._4_4_ * fVar154;
        auVar66._0_4_ = (float)local_9a0._0_4_ * fVar163;
        auVar66._8_4_ = fStack_998 * fVar165;
        auVar66._12_4_ = fStack_994 * fVar166;
        auVar66._16_4_ = fStack_990 * fVar156;
        auVar66._20_4_ = fStack_98c * fVar276;
        auVar66._24_4_ = fStack_988 * fVar277;
        auVar66._28_4_ = 0;
        auVar221 = vsubps_avx(auVar66,ZEXT1632(auVar92));
        auVar67._4_4_ = (float)local_9c0._4_4_ * fVar154;
        auVar67._0_4_ = (float)local_9c0._0_4_ * fVar163;
        auVar67._8_4_ = fStack_9b8 * fVar165;
        auVar67._12_4_ = fStack_9b4 * fVar166;
        auVar67._16_4_ = fStack_9b0 * fVar156;
        auVar67._20_4_ = fStack_9ac * fVar276;
        auVar67._24_4_ = fStack_9a8 * fVar277;
        auVar67._28_4_ = uStack_6a4;
        auVar15 = vsubps_avx(auVar67,ZEXT1632(auVar205));
        auVar259 = auVar15._0_28_;
        auVar14 = vcmpps_avx(auVar14,_DAT_01f7b000,5);
        auVar149._8_4_ = 0x7f800000;
        auVar149._0_8_ = 0x7f8000007f800000;
        auVar149._12_4_ = 0x7f800000;
        auVar149._16_4_ = 0x7f800000;
        auVar149._20_4_ = 0x7f800000;
        auVar149._24_4_ = 0x7f800000;
        auVar149._28_4_ = 0x7f800000;
        auVar232 = vblendvps_avx(auVar149,auVar60,auVar14);
        auVar15 = vmaxps_avx(local_600,local_420);
        auVar68._4_4_ = auVar15._4_4_ * 1.9073486e-06;
        auVar68._0_4_ = auVar15._0_4_ * 1.9073486e-06;
        auVar68._8_4_ = auVar15._8_4_ * 1.9073486e-06;
        auVar68._12_4_ = auVar15._12_4_ * 1.9073486e-06;
        auVar68._16_4_ = auVar15._16_4_ * 1.9073486e-06;
        auVar68._20_4_ = auVar15._20_4_ * 1.9073486e-06;
        auVar68._24_4_ = auVar15._24_4_ * 1.9073486e-06;
        auVar68._28_4_ = auVar15._28_4_;
        auVar15 = vcmpps_avx(local_440,auVar68,1);
        auVar150._8_4_ = 0xff800000;
        auVar150._0_8_ = 0xff800000ff800000;
        auVar150._12_4_ = 0xff800000;
        auVar150._16_4_ = 0xff800000;
        auVar150._20_4_ = 0xff800000;
        auVar150._24_4_ = 0xff800000;
        auVar150._28_4_ = 0xff800000;
        auVar247 = vblendvps_avx(auVar150,auVar61,auVar14);
        auVar219 = auVar14 & auVar15;
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0x7f,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0xbf,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar219[0x1f] < '\0') {
          auVar227 = vandps_avx(auVar14,auVar15);
          auVar15 = vcmpps_avx(auVar109,_DAT_01f7b000,2);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar109 = vblendvps_avx(auVar242,auVar237,auVar15);
          auVar95 = vpackssdw_avx(auVar227._0_16_,auVar227._16_16_);
          auVar219 = vpmovsxwd_avx2(auVar95);
          auVar232 = vblendvps_avx(auVar232,auVar109,auVar219);
          auVar109 = vblendvps_avx(auVar237,auVar242,auVar15);
          auVar247 = vblendvps_avx(auVar247,auVar109,auVar219);
          auVar153._0_8_ = auVar227._0_8_ ^ 0xffffffffffffffff;
          auVar153._8_4_ = auVar227._8_4_ ^ 0xffffffff;
          auVar153._12_4_ = auVar227._12_4_ ^ 0xffffffff;
          auVar153._16_4_ = auVar227._16_4_ ^ 0xffffffff;
          auVar153._20_4_ = auVar227._20_4_ ^ 0xffffffff;
          auVar153._24_4_ = auVar227._24_4_ ^ 0xffffffff;
          auVar153._28_4_ = auVar227._28_4_ ^ 0xffffffff;
          auVar227 = vorps_avx(auVar15,auVar153);
          auVar227 = vandps_avx(auVar14,auVar227);
        }
        auVar243 = ZEXT3264(auVar16);
      }
      auVar249 = ZEXT3264(auVar247);
      local_4e0 = local_920;
      local_4c0 = vminps_avx(local_480,auVar232);
      _local_880 = vmaxps_avx(local_920,auVar247);
      _local_4a0 = _local_880;
      auVar109 = vcmpps_avx(local_920,local_4c0,2);
      local_640 = vandps_avx(auVar109,auVar101);
      auVar109 = vcmpps_avx(_local_880,local_480,2);
      local_8a0 = vandps_avx(auVar109,auVar101);
      auVar101 = vorps_avx(local_8a0,local_640);
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0x7f,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0xbf,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar101[0x1f]) goto LAB_012c244b;
      auStack_93c = auVar17._4_28_;
      auVar69._4_4_ = auVar259._4_4_ * (float)local_9c0._4_4_;
      auVar69._0_4_ = auVar259._0_4_ * (float)local_9c0._0_4_;
      auVar69._8_4_ = auVar259._8_4_ * fStack_9b8;
      auVar69._12_4_ = auVar259._12_4_ * fStack_9b4;
      auVar69._16_4_ = auVar259._16_4_ * fStack_9b0;
      auVar69._20_4_ = auVar259._20_4_ * fStack_9ac;
      auVar69._24_4_ = auVar259._24_4_ * fStack_9a8;
      auVar69._28_4_ = auVar101._28_4_;
      auVar95 = vfmadd213ps_fma(auVar221,_local_9a0,auVar69);
      auVar95 = vfmadd213ps_fma(auVar185,_local_6c0,ZEXT1632(auVar95));
      auVar111._0_8_ = auVar227._0_8_ ^ 0xffffffffffffffff;
      auVar111._8_4_ = auVar227._8_4_ ^ 0xffffffff;
      auVar111._12_4_ = auVar227._12_4_ ^ 0xffffffff;
      auVar111._16_4_ = auVar227._16_4_ ^ 0xffffffff;
      auVar111._20_4_ = auVar227._20_4_ ^ 0xffffffff;
      auVar111._24_4_ = auVar227._24_4_ ^ 0xffffffff;
      auVar111._28_4_ = auVar227._28_4_ ^ 0xffffffff;
      auVar101 = vandps_avx(ZEXT1632(auVar95),local_6e0);
      auVar189._8_4_ = 0x3e99999a;
      auVar189._0_8_ = 0x3e99999a3e99999a;
      auVar189._12_4_ = 0x3e99999a;
      auVar189._16_4_ = 0x3e99999a;
      auVar189._20_4_ = 0x3e99999a;
      auVar189._24_4_ = 0x3e99999a;
      auVar189._28_4_ = 0x3e99999a;
      auVar101 = vcmpps_avx(auVar101,auVar189,1);
      _local_680 = vorps_avx(auVar101,auVar111);
      auVar70._4_4_ = (float)local_9c0._4_4_ * (float)local_c60._4_4_;
      auVar70._0_4_ = (float)local_9c0._0_4_ * (float)local_c60._0_4_;
      auVar70._8_4_ = fStack_9b8 * fStack_c58;
      auVar70._12_4_ = fStack_9b4 * fStack_c54;
      auVar70._16_4_ = fStack_9b0 * fStack_c50;
      auVar70._20_4_ = fStack_9ac * fStack_c4c;
      auVar70._24_4_ = fStack_9a8 * fStack_c48;
      auVar70._28_4_ = local_680._28_4_;
      auVar95 = vfmadd213ps_fma(auVar201,_local_9a0,auVar70);
      auVar95 = vfmadd213ps_fma(auVar243._0_32_,_local_6c0,ZEXT1632(auVar95));
      auVar243 = ZEXT1664(auVar95);
      auVar101 = vandps_avx(ZEXT1632(auVar95),local_6e0);
      auVar101 = vcmpps_avx(auVar101,auVar189,1);
      auVar101 = vorps_avx(auVar101,auVar111);
      auVar133._8_4_ = 3;
      auVar133._0_8_ = 0x300000003;
      auVar133._12_4_ = 3;
      auVar133._16_4_ = 3;
      auVar133._20_4_ = 3;
      auVar133._24_4_ = 3;
      auVar133._28_4_ = 3;
      auVar152._8_4_ = 2;
      auVar152._0_8_ = 0x200000002;
      auVar152._12_4_ = 2;
      auVar152._16_4_ = 2;
      auVar152._20_4_ = 2;
      auVar152._24_4_ = 2;
      auVar152._28_4_ = 2;
      auVar101 = vblendvps_avx(auVar152,auVar133,auVar101);
      local_6a0._4_4_ = local_c64;
      local_6a0._0_4_ = local_c64;
      local_6a0._8_4_ = local_c64;
      local_6a0._12_4_ = local_c64;
      local_6a0._16_4_ = local_c64;
      local_6a0._20_4_ = local_c64;
      local_6a0._24_4_ = local_c64;
      local_6a0._28_4_ = local_c64;
      local_660 = vpcmpgtd_avx2(auVar101,local_6a0);
      auVar101 = vpandn_avx2(local_660,local_640);
      local_860._4_4_ = local_920._4_4_ + (float)local_900._4_4_;
      local_860._0_4_ = local_920._0_4_ + (float)local_900._0_4_;
      fStack_858 = local_920._8_4_ + fStack_8f8;
      fStack_854 = local_920._12_4_ + fStack_8f4;
      fStack_850 = local_920._16_4_ + fStack_8f0;
      fStack_84c = local_920._20_4_ + fStack_8ec;
      fStack_848 = local_920._24_4_ + fStack_8e8;
      fStack_844 = local_920._28_4_ + fStack_8e4;
      while( true ) {
        local_500 = auVar101;
        fStack_bac = auVar2._4_4_;
        fStack_ba8 = auVar2._8_4_;
        fStack_ba4 = auVar2._12_4_;
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) break;
        auVar134._8_4_ = 0x7f800000;
        auVar134._0_8_ = 0x7f8000007f800000;
        auVar134._12_4_ = 0x7f800000;
        auVar134._16_4_ = 0x7f800000;
        auVar134._20_4_ = 0x7f800000;
        auVar134._24_4_ = 0x7f800000;
        auVar134._28_4_ = 0x7f800000;
        auVar227 = vblendvps_avx(auVar134,local_920,auVar101);
        auVar109 = vshufps_avx(auVar227,auVar227,0xb1);
        auVar109 = vminps_avx(auVar227,auVar109);
        auVar14 = vshufpd_avx(auVar109,auVar109,5);
        auVar109 = vminps_avx(auVar109,auVar14);
        auVar14 = vpermpd_avx2(auVar109,0x4e);
        auVar109 = vminps_avx(auVar109,auVar14);
        auVar227 = vcmpps_avx(auVar227,auVar109,0);
        auVar109 = auVar101 & auVar227;
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          auVar101 = vandps_avx(auVar227,auVar101);
        }
        uVar79 = vmovmskps_avx(auVar101);
        iVar18 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          iVar18 = iVar18 + 1;
        }
        uVar83 = iVar18 << 2;
        *(undefined4 *)(local_500 + uVar83) = 0;
        uVar79 = *(uint *)(local_1a0 + uVar83);
        uVar83 = *(uint *)(local_4e0 + uVar83);
        fVar141 = auVar10._0_4_;
        if ((float)local_9e0._0_4_ < 0.0) {
          auVar243 = ZEXT1664(auVar243._0_16_);
          auVar249 = ZEXT1664(auVar249._0_16_);
          fVar141 = sqrtf((float)local_9e0._0_4_);
        }
        auVar124 = vminps_avx(auVar3,auVar4);
        auVar95 = vmaxps_avx(auVar3,auVar4);
        auVar146 = vminps_avx(auVar1,auVar2);
        auVar92 = vminps_avx(auVar124,auVar146);
        auVar124 = vmaxps_avx(auVar1,auVar2);
        auVar146 = vmaxps_avx(auVar95,auVar124);
        local_ac0._8_4_ = NAN;
        local_ac0._0_8_ = 0x7fffffff7fffffff;
        local_ac0._12_4_ = NAN;
        auVar95 = vandps_avx(auVar92,local_ac0._0_16_);
        auVar124 = vandps_avx(auVar146,local_ac0._0_16_);
        auVar95 = vmaxps_avx(auVar95,auVar124);
        auVar124 = vmovshdup_avx(auVar95);
        auVar124 = vmaxss_avx(auVar124,auVar95);
        auVar95 = vshufpd_avx(auVar95,auVar95,1);
        auVar95 = vmaxss_avx(auVar95,auVar124);
        local_a00._0_4_ = auVar95._0_4_ * 1.9073486e-06;
        local_8e0._0_4_ = fVar141 * 1.9073486e-06;
        local_840._0_16_ = vshufps_avx(auVar146,auVar146,0xff);
        auVar95 = vinsertps_avx(ZEXT416(uVar83),ZEXT416(uVar79),0x10);
        auVar265 = ZEXT1664(auVar95);
        lVar82 = 5;
        do {
          do {
            bVar87 = lVar82 == 0;
            lVar82 = lVar82 + -1;
            if (bVar87) goto LAB_012c2e05;
            auVar204 = auVar265._0_16_;
            local_b00._0_16_ = vmovshdup_avx(auVar204);
            fVar159 = 1.0 - local_b00._0_4_;
            auVar95 = vshufps_avx(auVar204,auVar204,0x55);
            fVar141 = auVar95._0_4_;
            auVar118._0_4_ = fVar117 * fVar141;
            fVar155 = auVar95._4_4_;
            auVar118._4_4_ = auVar4._4_4_ * fVar155;
            fVar140 = auVar95._8_4_;
            auVar118._8_4_ = auVar4._8_4_ * fVar140;
            fVar157 = auVar95._12_4_;
            auVar118._12_4_ = auVar4._12_4_ * fVar157;
            auVar142._4_4_ = fVar159;
            auVar142._0_4_ = fVar159;
            auVar142._8_4_ = fVar159;
            auVar142._12_4_ = fVar159;
            auVar95 = vfmadd231ps_fma(auVar118,auVar142,auVar3);
            auVar168._0_4_ = fVar139 * fVar141;
            auVar168._4_4_ = auVar1._4_4_ * fVar155;
            auVar168._8_4_ = auVar1._8_4_ * fVar140;
            auVar168._12_4_ = auVar1._12_4_ * fVar157;
            auVar124 = vfmadd231ps_fma(auVar168,auVar142,auVar4);
            auVar206._0_4_ = fVar141 * auVar124._0_4_;
            auVar206._4_4_ = fVar155 * auVar124._4_4_;
            auVar206._8_4_ = fVar140 * auVar124._8_4_;
            auVar206._12_4_ = fVar157 * auVar124._12_4_;
            auVar146 = vfmadd231ps_fma(auVar206,auVar142,auVar95);
            auVar119._0_4_ = fVar141 * fVar167;
            auVar119._4_4_ = fVar155 * fStack_bac;
            auVar119._8_4_ = fVar140 * fStack_ba8;
            auVar119._12_4_ = fVar157 * fStack_ba4;
            auVar95 = vfmadd231ps_fma(auVar119,auVar142,auVar1);
            auVar191._0_4_ = fVar141 * auVar95._0_4_;
            auVar191._4_4_ = fVar155 * auVar95._4_4_;
            auVar191._8_4_ = fVar140 * auVar95._8_4_;
            auVar191._12_4_ = fVar157 * auVar95._12_4_;
            auVar124 = vfmadd231ps_fma(auVar191,auVar142,auVar124);
            uVar85 = auVar265._0_4_;
            auVar120._4_4_ = uVar85;
            auVar120._0_4_ = uVar85;
            auVar120._8_4_ = uVar85;
            auVar120._12_4_ = uVar85;
            auVar95 = vfmadd213ps_fma(auVar120,local_9d0,_DAT_01f45a50);
            auVar91._0_4_ = fVar141 * auVar124._0_4_;
            auVar91._4_4_ = fVar155 * auVar124._4_4_;
            auVar91._8_4_ = fVar140 * auVar124._8_4_;
            auVar91._12_4_ = fVar157 * auVar124._12_4_;
            auVar92 = vfmadd231ps_fma(auVar91,auVar146,auVar142);
            local_7c0._0_16_ = auVar92;
            auVar95 = vsubps_avx(auVar95,auVar92);
            _local_b40 = auVar95;
            auVar95 = vdpps_avx(auVar95,auVar95,0x7f);
            fVar141 = auVar95._0_4_;
            if (fVar141 < 0.0) {
              local_b20._0_16_ = ZEXT416((uint)fVar159);
              local_a60._0_16_ = auVar146;
              auVar116._0_4_ = sqrtf(fVar141);
              auVar116._4_60_ = extraout_var;
              auVar265 = ZEXT1664(auVar204);
              auVar92 = auVar116._0_16_;
              auVar146 = local_a60._0_16_;
              auVar205 = local_b20._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar95,auVar95);
              auVar205 = ZEXT416((uint)fVar159);
            }
            auVar124 = vsubps_avx(auVar124,auVar146);
            auVar223._0_4_ = auVar124._0_4_ * 3.0;
            auVar223._4_4_ = auVar124._4_4_ * 3.0;
            auVar223._8_4_ = auVar124._8_4_ * 3.0;
            auVar223._12_4_ = auVar124._12_4_ * 3.0;
            auVar124 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar205,local_b00._0_16_);
            auVar146 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b00._0_16_,auVar205);
            fVar155 = auVar205._0_4_ * 6.0;
            fVar140 = auVar124._0_4_ * 6.0;
            fVar157 = auVar146._0_4_ * 6.0;
            fVar159 = local_b00._0_4_ * 6.0;
            auVar169._0_4_ = fVar159 * fVar167;
            auVar169._4_4_ = fVar159 * fStack_bac;
            auVar169._8_4_ = fVar159 * fStack_ba8;
            auVar169._12_4_ = fVar159 * fStack_ba4;
            auVar121._4_4_ = fVar157;
            auVar121._0_4_ = fVar157;
            auVar121._8_4_ = fVar157;
            auVar121._12_4_ = fVar157;
            auVar124 = vfmadd132ps_fma(auVar121,auVar169,auVar1);
            auVar170._4_4_ = fVar140;
            auVar170._0_4_ = fVar140;
            auVar170._8_4_ = fVar140;
            auVar170._12_4_ = fVar140;
            auVar124 = vfmadd132ps_fma(auVar170,auVar124,auVar4);
            auVar146 = vdpps_avx(auVar223,auVar223,0x7f);
            auVar122._4_4_ = fVar155;
            auVar122._0_4_ = fVar155;
            auVar122._8_4_ = fVar155;
            auVar122._12_4_ = fVar155;
            auVar216 = vfmadd132ps_fma(auVar122,auVar124,auVar3);
            auVar124 = vblendps_avx(auVar146,_DAT_01f45a50,0xe);
            auVar205 = vrsqrtss_avx(auVar124,auVar124);
            fVar157 = auVar146._0_4_;
            fVar155 = auVar205._0_4_;
            auVar205 = vdpps_avx(auVar223,auVar216,0x7f);
            fVar155 = fVar155 * 1.5 + fVar157 * -0.5 * fVar155 * fVar155 * fVar155;
            auVar123._0_4_ = auVar216._0_4_ * fVar157;
            auVar123._4_4_ = auVar216._4_4_ * fVar157;
            auVar123._8_4_ = auVar216._8_4_ * fVar157;
            auVar123._12_4_ = auVar216._12_4_ * fVar157;
            fVar140 = auVar205._0_4_;
            auVar207._0_4_ = auVar223._0_4_ * fVar140;
            auVar207._4_4_ = auVar223._4_4_ * fVar140;
            auVar207._8_4_ = auVar223._8_4_ * fVar140;
            auVar207._12_4_ = auVar223._12_4_ * fVar140;
            auVar205 = vsubps_avx(auVar123,auVar207);
            auVar124 = vrcpss_avx(auVar124,auVar124);
            auVar216 = vfnmadd213ss_fma(auVar124,auVar146,ZEXT416(0x40000000));
            fVar140 = auVar124._0_4_ * auVar216._0_4_;
            auVar124 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                  ZEXT416((uint)(auVar265._0_4_ * (float)local_8e0._0_4_)));
            auVar240 = ZEXT1664(auVar124);
            uVar19 = CONCAT44(auVar223._4_4_,auVar223._0_4_);
            auVar217._0_8_ = uVar19 ^ 0x8000000080000000;
            auVar217._8_4_ = -auVar223._8_4_;
            auVar217._12_4_ = -auVar223._12_4_;
            auVar171._0_4_ = fVar155 * auVar205._0_4_ * fVar140;
            auVar171._4_4_ = fVar155 * auVar205._4_4_ * fVar140;
            auVar171._8_4_ = fVar155 * auVar205._8_4_ * fVar140;
            auVar171._12_4_ = fVar155 * auVar205._12_4_ * fVar140;
            auVar256._0_4_ = auVar223._0_4_ * fVar155;
            auVar256._4_4_ = auVar223._4_4_ * fVar155;
            auVar256._8_4_ = auVar223._8_4_ * fVar155;
            auVar256._12_4_ = auVar223._12_4_ * fVar155;
            local_b00._0_16_ = auVar223;
            local_b20._0_4_ = auVar124._0_4_;
            if (fVar157 < -fVar157) {
              local_a60._0_4_ = auVar92._0_4_;
              local_a80._0_16_ = auVar256;
              local_aa0 = auVar171._0_4_;
              fStack_a9c = auVar171._4_4_;
              fStack_a98 = auVar171._8_4_;
              fStack_a94 = auVar171._12_4_;
              fVar155 = sqrtf(fVar157);
              auVar171._4_4_ = fStack_a9c;
              auVar171._0_4_ = local_aa0;
              auVar171._8_4_ = fStack_a98;
              auVar171._12_4_ = fStack_a94;
              auVar92 = ZEXT416((uint)local_a60._0_4_);
              auVar240 = ZEXT464((uint)local_b20._0_4_);
              auVar256 = local_a80._0_16_;
            }
            else {
              auVar124 = vsqrtss_avx(auVar146,auVar146);
              fVar155 = auVar124._0_4_;
            }
            auVar124 = vdpps_avx(_local_b40,auVar256,0x7f);
            auVar216 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar92,auVar240._0_16_);
            auVar146 = vdpps_avx(auVar217,auVar256,0x7f);
            auVar205 = vdpps_avx(_local_b40,auVar171,0x7f);
            auVar9 = vdpps_avx(local_9d0,auVar256,0x7f);
            auVar216 = vfmadd213ss_fma(ZEXT416((uint)(auVar92._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_a00._0_4_ / fVar155)),auVar216);
            auVar243 = ZEXT1664(auVar216);
            fVar155 = auVar146._0_4_ + auVar205._0_4_;
            auVar93._0_4_ = auVar124._0_4_ * auVar124._0_4_;
            auVar93._4_4_ = auVar124._4_4_ * auVar124._4_4_;
            auVar93._8_4_ = auVar124._8_4_ * auVar124._8_4_;
            auVar93._12_4_ = auVar124._12_4_ * auVar124._12_4_;
            auVar146 = vdpps_avx(_local_b40,auVar217,0x7f);
            auVar205 = vsubps_avx(auVar95,auVar93);
            auVar92 = vrsqrtss_avx(auVar205,auVar205);
            fVar157 = auVar205._0_4_;
            fVar140 = auVar92._0_4_;
            fVar140 = fVar140 * 1.5 + fVar157 * -0.5 * fVar140 * fVar140 * fVar140;
            auVar92 = vdpps_avx(_local_b40,local_9d0,0x7f);
            auVar146 = vfnmadd231ss_fma(auVar146,auVar124,ZEXT416((uint)fVar155));
            auVar92 = vfnmadd231ss_fma(auVar92,auVar124,auVar9);
            if (fVar157 < 0.0) {
              local_a60._0_16_ = auVar124;
              local_a80._0_16_ = ZEXT416((uint)fVar155);
              local_aa0 = auVar9._0_4_;
              fStack_a9c = auVar9._4_4_;
              fStack_a98 = auVar9._8_4_;
              fStack_a94 = auVar9._12_4_;
              local_7e0._0_16_ = auVar146;
              local_800._0_4_ = fVar140;
              local_820._0_16_ = auVar92;
              fVar157 = sqrtf(fVar157);
              auVar9._4_4_ = fStack_a9c;
              auVar9._0_4_ = local_aa0;
              auVar9._8_4_ = fStack_a98;
              auVar9._12_4_ = fStack_a94;
              auVar243 = ZEXT464(auVar216._0_4_);
              auVar240 = ZEXT464((uint)local_b20._0_4_);
              fVar140 = (float)local_800._0_4_;
              auVar92 = local_820._0_16_;
              auVar124 = local_a60._0_16_;
              auVar146 = local_7e0._0_16_;
              auVar205 = local_a80._0_16_;
            }
            else {
              auVar205 = vsqrtss_avx(auVar205,auVar205);
              fVar157 = auVar205._0_4_;
              auVar205 = ZEXT416((uint)fVar155);
            }
            auVar249 = ZEXT1664(auVar124);
            auVar216 = vpermilps_avx(local_7c0._0_16_,0xff);
            fVar157 = fVar157 - auVar216._0_4_;
            auVar216 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
            auVar146 = vfmsub213ss_fma(auVar146,ZEXT416((uint)fVar140),auVar216);
            auVar172._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
            auVar172._8_4_ = auVar9._8_4_ ^ 0x80000000;
            auVar172._12_4_ = auVar9._12_4_ ^ 0x80000000;
            auVar192._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
            auVar192._8_4_ = auVar146._8_4_ ^ 0x80000000;
            auVar192._12_4_ = auVar146._12_4_ ^ 0x80000000;
            auVar143 = ZEXT416((uint)(auVar92._0_4_ * fVar140));
            auVar92 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar146._0_4_)),auVar205,
                                      auVar143);
            auVar146 = vinsertps_avx(auVar192,auVar143,0x1c);
            uVar85 = auVar92._0_4_;
            auVar193._4_4_ = uVar85;
            auVar193._0_4_ = uVar85;
            auVar193._8_4_ = uVar85;
            auVar193._12_4_ = uVar85;
            auVar146 = vdivps_avx(auVar146,auVar193);
            auVar92 = vinsertps_avx(auVar205,auVar172,0x10);
            auVar92 = vdivps_avx(auVar92,auVar193);
            fVar155 = auVar124._0_4_;
            auVar144._0_4_ = fVar155 * auVar146._0_4_ + fVar157 * auVar92._0_4_;
            auVar144._4_4_ = fVar155 * auVar146._4_4_ + fVar157 * auVar92._4_4_;
            auVar144._8_4_ = fVar155 * auVar146._8_4_ + fVar157 * auVar92._8_4_;
            auVar144._12_4_ = fVar155 * auVar146._12_4_ + fVar157 * auVar92._12_4_;
            auVar92 = vsubps_avx(auVar204,auVar144);
            auVar265 = ZEXT1664(auVar92);
            auVar146 = vandps_avx(auVar124,local_ac0._0_16_);
          } while (auVar243._0_4_ <= auVar146._0_4_);
          auVar204 = vfmadd231ss_fma(ZEXT416((uint)(auVar240._0_4_ + auVar243._0_4_)),
                                     local_840._0_16_,ZEXT416(0x36000000));
          auVar146 = vandps_avx(ZEXT416((uint)fVar157),local_ac0._0_16_);
        } while (auVar204._0_4_ <= auVar146._0_4_);
        fVar155 = auVar92._0_4_ + (float)local_970._0_4_;
        if ((fVar88 <= fVar155) && (fVar140 = *(float *)(ray + k * 4 + 0x80), fVar155 <= fVar140)) {
          auVar146 = vmovshdup_avx(auVar92);
          fVar157 = auVar146._0_4_;
          if ((0.0 <= fVar157) && (fVar157 <= 1.0)) {
            auVar95 = vrsqrtss_avx(auVar95,auVar95);
            fVar159 = auVar95._0_4_;
            pGVar7 = (context->scene->geometries).items[uVar80].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar141 = fVar159 * 1.5 + fVar141 * -0.5 * fVar159 * fVar159 * fVar159;
              auVar173._0_4_ = fVar141 * (float)local_b40._0_4_;
              auVar173._4_4_ = fVar141 * (float)local_b40._4_4_;
              auVar173._8_4_ = fVar141 * fStack_b38;
              auVar173._12_4_ = fVar141 * fStack_b34;
              auVar205 = vfmadd213ps_fma(auVar216,auVar173,local_b00._0_16_);
              auVar95 = vshufps_avx(auVar173,auVar173,0xc9);
              auVar146 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
              auVar174._0_4_ = auVar173._0_4_ * auVar146._0_4_;
              auVar174._4_4_ = auVar173._4_4_ * auVar146._4_4_;
              auVar174._8_4_ = auVar173._8_4_ * auVar146._8_4_;
              auVar174._12_4_ = auVar173._12_4_ * auVar146._12_4_;
              auVar204 = vfmsub231ps_fma(auVar174,local_b00._0_16_,auVar95);
              auVar95 = vshufps_avx(auVar204,auVar204,0xc9);
              auVar146 = vshufps_avx(auVar205,auVar205,0xc9);
              auVar204 = vshufps_avx(auVar204,auVar204,0xd2);
              auVar94._0_4_ = auVar205._0_4_ * auVar204._0_4_;
              auVar94._4_4_ = auVar205._4_4_ * auVar204._4_4_;
              auVar94._8_4_ = auVar205._8_4_ * auVar204._8_4_;
              auVar94._12_4_ = auVar205._12_4_ * auVar204._12_4_;
              auVar95 = vfmsub231ps_fma(auVar94,auVar95,auVar146);
              uVar85 = auVar95._0_4_;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = fVar155;
                uVar6 = vextractps_avx(auVar95,1);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                uVar6 = vextractps_avx(auVar95,2);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar85;
                *(float *)(ray + k * 4 + 0xf0) = fVar157;
                *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                *(undefined4 *)(ray + k * 4 + 0x110) = local_940;
                *(uint *)(ray + k * 4 + 0x120) = uVar80;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_750 = vshufps_avx(auVar92,auVar92,0x55);
                auVar146 = vshufps_avx(auVar95,auVar95,0x55);
                auStack_770 = vshufps_avx(auVar95,auVar95,0xaa);
                local_780 = (RTCHitN  [16])auVar146;
                local_760 = uVar85;
                uStack_75c = uVar85;
                uStack_758 = uVar85;
                uStack_754 = uVar85;
                local_740 = ZEXT416(0) << 0x20;
                local_730 = CONCAT44(uStack_79c,local_7a0);
                uStack_728 = CONCAT44(uStack_794,uStack_798);
                local_720._4_4_ = uStack_78c;
                local_720._0_4_ = local_790;
                local_720._8_4_ = uStack_788;
                local_720._12_4_ = uStack_784;
                vpcmpeqd_avx2(ZEXT1632(local_720),ZEXT1632(local_720));
                uStack_70c = context->user->instID[0];
                local_710 = uStack_70c;
                uStack_708 = uStack_70c;
                uStack_704 = uStack_70c;
                uStack_700 = context->user->instPrimID[0];
                uStack_6fc = uStack_700;
                uStack_6f8 = uStack_700;
                uStack_6f4 = uStack_700;
                *(float *)(ray + k * 4 + 0x80) = fVar155;
                local_8c0._0_16_ = *local_ac8;
                local_b70.valid = (int *)local_8c0;
                local_b70.geometryUserPtr = pGVar7->userPtr;
                local_b70.context = context->user;
                local_b70.hit = local_780;
                local_b70.N = 4;
                auVar95 = *local_ac8;
                local_b70.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar243 = ZEXT1664(auVar243._0_16_);
                  auVar249 = ZEXT1664(auVar124);
                  (*pGVar7->intersectionFilterN)(&local_b70);
                  auVar95 = local_8c0._0_16_;
                }
                if (auVar95 == (undefined1  [16])0x0) {
                  auVar124 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar124 = auVar124 ^ _DAT_01f46b70;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar243 = ZEXT1664(auVar243._0_16_);
                    auVar249 = ZEXT1664(auVar249._0_16_);
                    (*p_Var8)(&local_b70);
                    auVar95 = local_8c0._0_16_;
                  }
                  auVar92 = vpcmpeqd_avx(auVar95,_DAT_01f45a50);
                  auVar146 = vpcmpeqd_avx(auVar146,auVar146);
                  auVar124 = auVar92 ^ auVar146;
                  if (auVar95 != (undefined1  [16])0x0) {
                    auVar92 = auVar92 ^ auVar146;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])local_b70.hit);
                    *(undefined1 (*) [16])(local_b70.ray + 0xc0) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x10));
                    *(undefined1 (*) [16])(local_b70.ray + 0xd0) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x20));
                    *(undefined1 (*) [16])(local_b70.ray + 0xe0) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x30));
                    *(undefined1 (*) [16])(local_b70.ray + 0xf0) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x40));
                    *(undefined1 (*) [16])(local_b70.ray + 0x100) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x50));
                    *(undefined1 (*) [16])(local_b70.ray + 0x110) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x60));
                    *(undefined1 (*) [16])(local_b70.ray + 0x120) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x70));
                    *(undefined1 (*) [16])(local_b70.ray + 0x130) = auVar95;
                    auVar95 = vmaskmovps_avx(auVar92,*(undefined1 (*) [16])(local_b70.hit + 0x80));
                    *(undefined1 (*) [16])(local_b70.ray + 0x140) = auVar95;
                  }
                }
                auVar96._8_8_ = 0x100000001;
                auVar96._0_8_ = 0x100000001;
                if ((auVar96 & auVar124) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar140;
                }
              }
            }
          }
        }
LAB_012c2e05:
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar238._4_4_ = uVar85;
        auVar238._0_4_ = uVar85;
        auVar238._8_4_ = uVar85;
        auVar238._12_4_ = uVar85;
        auVar238._16_4_ = uVar85;
        auVar238._20_4_ = uVar85;
        auVar238._24_4_ = uVar85;
        auVar238._28_4_ = uVar85;
        auVar240 = ZEXT3264(auVar238);
        auVar101 = vcmpps_avx(_local_860,auVar238,2);
        auVar101 = vandps_avx(auVar101,local_500);
      }
      auVar112._0_4_ = (float)local_900._0_4_ + (float)local_880._0_4_;
      auVar112._4_4_ = (float)local_900._4_4_ + (float)local_880._4_4_;
      auVar112._8_4_ = fStack_8f8 + fStack_878;
      auVar112._12_4_ = fStack_8f4 + fStack_874;
      auVar112._16_4_ = fStack_8f0 + fStack_870;
      auVar112._20_4_ = fStack_8ec + fStack_86c;
      auVar112._24_4_ = fStack_8e8 + fStack_868;
      auVar112._28_4_ = fStack_8e4 + fStack_864;
      uVar85 = auVar240._0_4_;
      auVar135._4_4_ = uVar85;
      auVar135._0_4_ = uVar85;
      auVar135._8_4_ = uVar85;
      auVar135._12_4_ = uVar85;
      auVar135._16_4_ = uVar85;
      auVar135._20_4_ = uVar85;
      auVar135._24_4_ = uVar85;
      auVar135._28_4_ = uVar85;
      auVar101 = vcmpps_avx(auVar112,auVar135,2);
      _local_880 = vandps_avx(auVar101,local_8a0);
      auVar113._8_4_ = 3;
      auVar113._0_8_ = 0x300000003;
      auVar113._12_4_ = 3;
      auVar113._16_4_ = 3;
      auVar113._20_4_ = 3;
      auVar113._24_4_ = 3;
      auVar113._28_4_ = 3;
      auVar136._8_4_ = 2;
      auVar136._0_8_ = 0x200000002;
      auVar136._12_4_ = 2;
      auVar136._16_4_ = 2;
      auVar136._20_4_ = 2;
      auVar136._24_4_ = 2;
      auVar136._28_4_ = 2;
      auVar101 = vblendvps_avx(auVar136,auVar113,_local_680);
      local_8a0 = vpcmpgtd_avx2(auVar101,local_6a0);
      local_8c0 = vpandn_avx2(local_8a0,_local_880);
      local_920 = _local_4a0;
      local_860._4_4_ = (float)local_900._4_4_ + (float)local_4a0._4_4_;
      local_860._0_4_ = (float)local_900._0_4_ + (float)local_4a0._0_4_;
      fStack_858 = fStack_8f8 + fStack_498;
      fStack_854 = fStack_8f4 + fStack_494;
      fStack_850 = fStack_8f0 + fStack_490;
      fStack_84c = fStack_8ec + fStack_48c;
      fStack_848 = fStack_8e8 + fStack_488;
      fStack_844 = fStack_8e4 + fStack_484;
      auVar271 = ZEXT3264(local_a20);
      auVar265 = ZEXT3264(local_a40);
      for (; (((((((local_8c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (local_8c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_8c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(local_8c0 >> 0x7f,0) != '\0') ||
               (local_8c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(local_8c0 >> 0xbf,0) != '\0') ||
             (local_8c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             local_8c0[0x1f] < '\0'; local_8c0 = vandps_avx(auVar101,local_8c0)) {
        auVar137._8_4_ = 0x7f800000;
        auVar137._0_8_ = 0x7f8000007f800000;
        auVar137._12_4_ = 0x7f800000;
        auVar137._16_4_ = 0x7f800000;
        auVar137._20_4_ = 0x7f800000;
        auVar137._24_4_ = 0x7f800000;
        auVar137._28_4_ = 0x7f800000;
        auVar101 = vblendvps_avx(auVar137,local_920,local_8c0);
        auVar227 = vshufps_avx(auVar101,auVar101,0xb1);
        auVar227 = vminps_avx(auVar101,auVar227);
        auVar109 = vshufpd_avx(auVar227,auVar227,5);
        auVar227 = vminps_avx(auVar227,auVar109);
        auVar109 = vpermpd_avx2(auVar227,0x4e);
        auVar227 = vminps_avx(auVar227,auVar109);
        auVar227 = vcmpps_avx(auVar101,auVar227,0);
        auVar109 = local_8c0 & auVar227;
        auVar101 = local_8c0;
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          auVar101 = vandps_avx(auVar227,local_8c0);
        }
        uVar79 = vmovmskps_avx(auVar101);
        iVar18 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          iVar18 = iVar18 + 1;
        }
        uVar83 = iVar18 << 2;
        *(undefined4 *)(local_8c0 + uVar83) = 0;
        uVar79 = *(uint *)(local_1c0 + uVar83);
        uVar83 = *(uint *)(local_480 + uVar83);
        fVar141 = auVar11._0_4_;
        if ((float)local_9e0._0_4_ < 0.0) {
          auVar243 = ZEXT1664(auVar243._0_16_);
          auVar249 = ZEXT1664(auVar249._0_16_);
          fVar141 = sqrtf((float)local_9e0._0_4_);
          auVar265 = ZEXT3264(local_a40);
          auVar271 = ZEXT3264(local_a20);
        }
        auVar124 = vminps_avx(auVar3,auVar4);
        auVar95 = vmaxps_avx(auVar3,auVar4);
        auVar146 = vminps_avx(auVar1,auVar2);
        auVar92 = vminps_avx(auVar124,auVar146);
        auVar124 = vmaxps_avx(auVar1,auVar2);
        auVar146 = vmaxps_avx(auVar95,auVar124);
        local_8e0._8_4_ = NAN;
        local_8e0._0_8_ = 0x7fffffff7fffffff;
        local_8e0._12_4_ = NAN;
        auVar95 = vandps_avx(auVar92,local_8e0._0_16_);
        auVar124 = vandps_avx(auVar146,local_8e0._0_16_);
        auVar95 = vmaxps_avx(auVar95,auVar124);
        auVar124 = vmovshdup_avx(auVar95);
        auVar124 = vmaxss_avx(auVar124,auVar95);
        auVar95 = vshufpd_avx(auVar95,auVar95,1);
        auVar95 = vmaxss_avx(auVar95,auVar124);
        local_a00._0_4_ = auVar95._0_4_ * 1.9073486e-06;
        local_a60._0_4_ = fVar141 * 1.9073486e-06;
        local_840._0_16_ = vshufps_avx(auVar146,auVar146,0xff);
        auVar95 = vinsertps_avx(ZEXT416(uVar83),ZEXT416(uVar79),0x10);
        auVar240 = ZEXT1664(auVar95);
        lVar82 = 5;
        do {
          do {
            bVar87 = lVar82 == 0;
            lVar82 = lVar82 + -1;
            if (bVar87) goto LAB_012c38ce;
            auVar204 = auVar240._0_16_;
            local_b00._0_16_ = vmovshdup_avx(auVar204);
            fVar159 = 1.0 - local_b00._0_4_;
            auVar95 = vshufps_avx(auVar204,auVar204,0x55);
            fVar141 = auVar95._0_4_;
            auVar125._0_4_ = fVar117 * fVar141;
            fVar155 = auVar95._4_4_;
            auVar125._4_4_ = auVar4._4_4_ * fVar155;
            fVar140 = auVar95._8_4_;
            auVar125._8_4_ = auVar4._8_4_ * fVar140;
            fVar157 = auVar95._12_4_;
            auVar125._12_4_ = auVar4._12_4_ * fVar157;
            auVar145._4_4_ = fVar159;
            auVar145._0_4_ = fVar159;
            auVar145._8_4_ = fVar159;
            auVar145._12_4_ = fVar159;
            auVar95 = vfmadd231ps_fma(auVar125,auVar145,auVar3);
            auVar175._0_4_ = fVar139 * fVar141;
            auVar175._4_4_ = auVar1._4_4_ * fVar155;
            auVar175._8_4_ = auVar1._8_4_ * fVar140;
            auVar175._12_4_ = auVar1._12_4_ * fVar157;
            auVar124 = vfmadd231ps_fma(auVar175,auVar145,auVar4);
            auVar208._0_4_ = fVar141 * auVar124._0_4_;
            auVar208._4_4_ = fVar155 * auVar124._4_4_;
            auVar208._8_4_ = fVar140 * auVar124._8_4_;
            auVar208._12_4_ = fVar157 * auVar124._12_4_;
            auVar146 = vfmadd231ps_fma(auVar208,auVar145,auVar95);
            auVar126._0_4_ = fVar141 * fVar167;
            auVar126._4_4_ = fVar155 * fStack_bac;
            auVar126._8_4_ = fVar140 * fStack_ba8;
            auVar126._12_4_ = fVar157 * fStack_ba4;
            auVar95 = vfmadd231ps_fma(auVar126,auVar145,auVar1);
            auVar194._0_4_ = fVar141 * auVar95._0_4_;
            auVar194._4_4_ = fVar155 * auVar95._4_4_;
            auVar194._8_4_ = fVar140 * auVar95._8_4_;
            auVar194._12_4_ = fVar157 * auVar95._12_4_;
            auVar124 = vfmadd231ps_fma(auVar194,auVar145,auVar124);
            uVar85 = auVar240._0_4_;
            auVar127._4_4_ = uVar85;
            auVar127._0_4_ = uVar85;
            auVar127._8_4_ = uVar85;
            auVar127._12_4_ = uVar85;
            auVar95 = vfmadd213ps_fma(auVar127,local_9d0,_DAT_01f45a50);
            auVar97._0_4_ = fVar141 * auVar124._0_4_;
            auVar97._4_4_ = fVar155 * auVar124._4_4_;
            auVar97._8_4_ = fVar140 * auVar124._8_4_;
            auVar97._12_4_ = fVar157 * auVar124._12_4_;
            auVar92 = vfmadd231ps_fma(auVar97,auVar146,auVar145);
            local_7c0._0_16_ = auVar92;
            auVar95 = vsubps_avx(auVar95,auVar92);
            _local_b40 = auVar95;
            auVar95 = vdpps_avx(auVar95,auVar95,0x7f);
            fVar141 = auVar95._0_4_;
            if (fVar141 < 0.0) {
              local_b20._0_16_ = ZEXT416((uint)fVar159);
              local_ac0._0_16_ = auVar146;
              auVar265._0_4_ = sqrtf(fVar141);
              auVar265._4_60_ = extraout_var_00;
              auVar240 = ZEXT1664(auVar204);
              auVar92 = auVar265._0_16_;
              auVar146 = local_ac0._0_16_;
              auVar205 = local_b20._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar95,auVar95);
              auVar205 = ZEXT416((uint)fVar159);
            }
            auVar124 = vsubps_avx(auVar124,auVar146);
            auVar224._0_4_ = auVar124._0_4_ * 3.0;
            auVar224._4_4_ = auVar124._4_4_ * 3.0;
            auVar224._8_4_ = auVar124._8_4_ * 3.0;
            auVar224._12_4_ = auVar124._12_4_ * 3.0;
            auVar124 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar205,local_b00._0_16_);
            auVar146 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b00._0_16_,auVar205);
            fVar155 = auVar205._0_4_ * 6.0;
            fVar140 = auVar124._0_4_ * 6.0;
            fVar157 = auVar146._0_4_ * 6.0;
            fVar159 = local_b00._0_4_ * 6.0;
            auVar176._0_4_ = fVar159 * fVar167;
            auVar176._4_4_ = fVar159 * fStack_bac;
            auVar176._8_4_ = fVar159 * fStack_ba8;
            auVar176._12_4_ = fVar159 * fStack_ba4;
            auVar128._4_4_ = fVar157;
            auVar128._0_4_ = fVar157;
            auVar128._8_4_ = fVar157;
            auVar128._12_4_ = fVar157;
            auVar124 = vfmadd132ps_fma(auVar128,auVar176,auVar1);
            auVar177._4_4_ = fVar140;
            auVar177._0_4_ = fVar140;
            auVar177._8_4_ = fVar140;
            auVar177._12_4_ = fVar140;
            auVar124 = vfmadd132ps_fma(auVar177,auVar124,auVar4);
            auVar146 = vdpps_avx(auVar224,auVar224,0x7f);
            auVar129._4_4_ = fVar155;
            auVar129._0_4_ = fVar155;
            auVar129._8_4_ = fVar155;
            auVar129._12_4_ = fVar155;
            auVar216 = vfmadd132ps_fma(auVar129,auVar124,auVar3);
            auVar124 = vblendps_avx(auVar146,_DAT_01f45a50,0xe);
            auVar205 = vrsqrtss_avx(auVar124,auVar124);
            fVar157 = auVar146._0_4_;
            fVar155 = auVar205._0_4_;
            auVar205 = vdpps_avx(auVar224,auVar216,0x7f);
            fVar155 = fVar155 * 1.5 + fVar157 * -0.5 * fVar155 * fVar155 * fVar155;
            auVar130._0_4_ = auVar216._0_4_ * fVar157;
            auVar130._4_4_ = auVar216._4_4_ * fVar157;
            auVar130._8_4_ = auVar216._8_4_ * fVar157;
            auVar130._12_4_ = auVar216._12_4_ * fVar157;
            fVar140 = auVar205._0_4_;
            auVar209._0_4_ = auVar224._0_4_ * fVar140;
            auVar209._4_4_ = auVar224._4_4_ * fVar140;
            auVar209._8_4_ = auVar224._8_4_ * fVar140;
            auVar209._12_4_ = auVar224._12_4_ * fVar140;
            auVar205 = vsubps_avx(auVar130,auVar209);
            auVar124 = vrcpss_avx(auVar124,auVar124);
            auVar216 = vfnmadd213ss_fma(auVar124,auVar146,ZEXT416(0x40000000));
            fVar140 = auVar124._0_4_ * auVar216._0_4_;
            auVar124 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                  ZEXT416((uint)(auVar240._0_4_ * (float)local_a60._0_4_)));
            auVar243 = ZEXT1664(auVar124);
            uVar19 = CONCAT44(auVar224._4_4_,auVar224._0_4_);
            auVar258._0_8_ = uVar19 ^ 0x8000000080000000;
            auVar258._8_4_ = -auVar224._8_4_;
            auVar258._12_4_ = -auVar224._12_4_;
            auVar178._0_4_ = fVar155 * auVar205._0_4_ * fVar140;
            auVar178._4_4_ = fVar155 * auVar205._4_4_ * fVar140;
            auVar178._8_4_ = fVar155 * auVar205._8_4_ * fVar140;
            auVar178._12_4_ = fVar155 * auVar205._12_4_ * fVar140;
            auVar218._0_4_ = auVar224._0_4_ * fVar155;
            auVar218._4_4_ = auVar224._4_4_ * fVar155;
            auVar218._8_4_ = auVar224._8_4_ * fVar155;
            auVar218._12_4_ = auVar224._12_4_ * fVar155;
            local_b00._0_16_ = auVar224;
            local_b20._0_4_ = auVar124._0_4_;
            if (fVar157 < -fVar157) {
              local_ac0._0_4_ = auVar92._0_4_;
              local_a80._0_16_ = auVar218;
              local_aa0 = auVar178._0_4_;
              fStack_a9c = auVar178._4_4_;
              fStack_a98 = auVar178._8_4_;
              fStack_a94 = auVar178._12_4_;
              fVar155 = sqrtf(fVar157);
              auVar178._4_4_ = fStack_a9c;
              auVar178._0_4_ = local_aa0;
              auVar178._8_4_ = fStack_a98;
              auVar178._12_4_ = fStack_a94;
              auVar92 = ZEXT416((uint)local_ac0._0_4_);
              auVar243 = ZEXT464((uint)local_b20._0_4_);
              auVar218 = local_a80._0_16_;
            }
            else {
              auVar124 = vsqrtss_avx(auVar146,auVar146);
              fVar155 = auVar124._0_4_;
            }
            auVar124 = vdpps_avx(_local_b40,auVar218,0x7f);
            auVar143 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar92,auVar243._0_16_);
            auVar146 = vdpps_avx(auVar258,auVar218,0x7f);
            auVar205 = vdpps_avx(_local_b40,auVar178,0x7f);
            auVar216 = vdpps_avx(local_9d0,auVar218,0x7f);
            auVar143 = vfmadd213ss_fma(ZEXT416((uint)(auVar92._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_a00._0_4_ / fVar155)),auVar143);
            fVar155 = auVar146._0_4_ + auVar205._0_4_;
            auVar273 = ZEXT416((uint)fVar155);
            fVar157 = auVar124._0_4_;
            auVar98._0_4_ = fVar157 * fVar157;
            auVar98._4_4_ = auVar124._4_4_ * auVar124._4_4_;
            auVar98._8_4_ = auVar124._8_4_ * auVar124._8_4_;
            auVar98._12_4_ = auVar124._12_4_ * auVar124._12_4_;
            auVar146 = vdpps_avx(_local_b40,auVar258,0x7f);
            auVar205 = vsubps_avx(auVar95,auVar98);
            auVar92 = vrsqrtss_avx(auVar205,auVar205);
            fVar159 = auVar205._0_4_;
            fVar140 = auVar92._0_4_;
            fVar140 = fVar140 * 1.5 + fVar159 * -0.5 * fVar140 * fVar140 * fVar140;
            auVar92 = vdpps_avx(_local_b40,local_9d0,0x7f);
            local_ac0._0_16_ = vfnmadd231ss_fma(auVar146,auVar124,ZEXT416((uint)fVar155));
            auVar146 = vfnmadd231ss_fma(auVar92,auVar124,auVar216);
            if (fVar159 < 0.0) {
              local_a80._0_4_ = auVar143._0_4_;
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              local_7e0._0_16_ = auVar216;
              local_800._0_4_ = fVar140;
              local_820._0_16_ = auVar146;
              local_aa0 = fVar155;
              fVar155 = sqrtf(fVar159);
              auVar273._4_4_ = fStack_a9c;
              auVar273._0_4_ = local_aa0;
              auVar273._8_4_ = fStack_a98;
              auVar273._12_4_ = fStack_a94;
              auVar243 = ZEXT464((uint)local_b20._0_4_);
              fVar140 = (float)local_800._0_4_;
              auVar146 = local_820._0_16_;
              auVar216 = local_7e0._0_16_;
              fVar159 = (float)local_a80._0_4_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar205,auVar205);
              fVar155 = auVar92._0_4_;
              fVar159 = auVar143._0_4_;
            }
            auVar249 = ZEXT1664(auVar124);
            auVar271 = ZEXT3264(local_a20);
            auVar265 = ZEXT3264(local_a40);
            auVar92 = vpermilps_avx(local_7c0._0_16_,0xff);
            fVar155 = fVar155 - auVar92._0_4_;
            auVar205 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
            auVar92 = vfmsub213ss_fma(local_ac0._0_16_,ZEXT416((uint)fVar140),auVar205);
            auVar179._0_8_ = auVar216._0_8_ ^ 0x8000000080000000;
            auVar179._8_4_ = auVar216._8_4_ ^ 0x80000000;
            auVar179._12_4_ = auVar216._12_4_ ^ 0x80000000;
            auVar195._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar195._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar195._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar146 = ZEXT416((uint)(auVar146._0_4_ * fVar140));
            auVar92 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar216._0_4_)),auVar273,
                                      auVar146);
            auVar146 = vinsertps_avx(auVar195,auVar146,0x1c);
            uVar85 = auVar92._0_4_;
            auVar196._4_4_ = uVar85;
            auVar196._0_4_ = uVar85;
            auVar196._8_4_ = uVar85;
            auVar196._12_4_ = uVar85;
            auVar146 = vdivps_avx(auVar146,auVar196);
            auVar92 = vinsertps_avx(auVar273,auVar179,0x10);
            auVar92 = vdivps_avx(auVar92,auVar196);
            auVar147._0_4_ = fVar157 * auVar146._0_4_ + fVar155 * auVar92._0_4_;
            auVar147._4_4_ = fVar157 * auVar146._4_4_ + fVar155 * auVar92._4_4_;
            auVar147._8_4_ = fVar157 * auVar146._8_4_ + fVar155 * auVar92._8_4_;
            auVar147._12_4_ = fVar157 * auVar146._12_4_ + fVar155 * auVar92._12_4_;
            auVar92 = vsubps_avx(auVar204,auVar147);
            auVar240 = ZEXT1664(auVar92);
            auVar146 = vandps_avx(auVar124,local_8e0._0_16_);
          } while (fVar159 <= auVar146._0_4_);
          auVar204 = vfmadd231ss_fma(ZEXT416((uint)(auVar243._0_4_ + fVar159)),local_840._0_16_,
                                     ZEXT416(0x36000000));
          auVar146 = vandps_avx(ZEXT416((uint)fVar155),local_8e0._0_16_);
        } while (auVar204._0_4_ <= auVar146._0_4_);
        fVar155 = auVar92._0_4_ + (float)local_970._0_4_;
        if (fVar88 <= fVar155) {
          fVar140 = *(float *)(ray + k * 4 + 0x80);
          auVar243 = ZEXT464((uint)fVar140);
          if (fVar155 <= fVar140) {
            auVar146 = vmovshdup_avx(auVar92);
            fVar157 = auVar146._0_4_;
            if ((0.0 <= fVar157) && (fVar157 <= 1.0)) {
              auVar95 = vrsqrtss_avx(auVar95,auVar95);
              fVar159 = auVar95._0_4_;
              pGVar7 = (context->scene->geometries).items[uVar80].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar141 = fVar159 * 1.5 + fVar141 * -0.5 * fVar159 * fVar159 * fVar159;
                auVar180._0_4_ = fVar141 * (float)local_b40._0_4_;
                auVar180._4_4_ = fVar141 * (float)local_b40._4_4_;
                auVar180._8_4_ = fVar141 * fStack_b38;
                auVar180._12_4_ = fVar141 * fStack_b34;
                auVar205 = vfmadd213ps_fma(auVar205,auVar180,local_b00._0_16_);
                auVar95 = vshufps_avx(auVar180,auVar180,0xc9);
                auVar146 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                auVar181._0_4_ = auVar180._0_4_ * auVar146._0_4_;
                auVar181._4_4_ = auVar180._4_4_ * auVar146._4_4_;
                auVar181._8_4_ = auVar180._8_4_ * auVar146._8_4_;
                auVar181._12_4_ = auVar180._12_4_ * auVar146._12_4_;
                auVar204 = vfmsub231ps_fma(auVar181,local_b00._0_16_,auVar95);
                auVar95 = vshufps_avx(auVar204,auVar204,0xc9);
                auVar146 = vshufps_avx(auVar205,auVar205,0xc9);
                auVar204 = vshufps_avx(auVar204,auVar204,0xd2);
                auVar99._0_4_ = auVar205._0_4_ * auVar204._0_4_;
                auVar99._4_4_ = auVar205._4_4_ * auVar204._4_4_;
                auVar99._8_4_ = auVar205._8_4_ * auVar204._8_4_;
                auVar99._12_4_ = auVar205._12_4_ * auVar204._12_4_;
                auVar95 = vfmsub231ps_fma(auVar99,auVar95,auVar146);
                uVar85 = auVar95._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar155;
                  uVar6 = vextractps_avx(auVar95,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                  uVar6 = vextractps_avx(auVar95,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar85;
                  *(float *)(ray + k * 4 + 0xf0) = fVar157;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x110) = local_940;
                  *(uint *)(ray + k * 4 + 0x120) = uVar80;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_750 = vshufps_avx(auVar92,auVar92,0x55);
                  auVar146 = vshufps_avx(auVar95,auVar95,0x55);
                  auStack_770 = vshufps_avx(auVar95,auVar95,0xaa);
                  local_780 = (RTCHitN  [16])auVar146;
                  local_760 = uVar85;
                  uStack_75c = uVar85;
                  uStack_758 = uVar85;
                  uStack_754 = uVar85;
                  local_740 = ZEXT416(0) << 0x20;
                  local_730 = CONCAT44(uStack_79c,local_7a0);
                  uStack_728 = CONCAT44(uStack_794,uStack_798);
                  local_720._4_4_ = uStack_78c;
                  local_720._0_4_ = local_790;
                  local_720._8_4_ = uStack_788;
                  local_720._12_4_ = uStack_784;
                  vpcmpeqd_avx2(ZEXT1632(local_720),ZEXT1632(local_720));
                  uStack_70c = context->user->instID[0];
                  local_710 = uStack_70c;
                  uStack_708 = uStack_70c;
                  uStack_704 = uStack_70c;
                  uStack_700 = context->user->instPrimID[0];
                  uStack_6fc = uStack_700;
                  uStack_6f8 = uStack_700;
                  uStack_6f4 = uStack_700;
                  *(float *)(ray + k * 4 + 0x80) = fVar155;
                  local_960 = *local_ac8;
                  local_b70.valid = (int *)local_960;
                  local_b70.geometryUserPtr = pGVar7->userPtr;
                  local_b70.context = context->user;
                  local_b70.hit = local_780;
                  local_b70.N = 4;
                  local_b70.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar249 = ZEXT1664(auVar124);
                    (*pGVar7->intersectionFilterN)(&local_b70);
                    auVar265 = ZEXT3264(local_a40);
                    auVar271 = ZEXT3264(local_a20);
                  }
                  if (local_960 == (undefined1  [16])0x0) {
                    auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar95 = auVar95 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      (*p_Var8)(&local_b70);
                      auVar265 = ZEXT3264(local_a40);
                      auVar271 = ZEXT3264(local_a20);
                    }
                    auVar124 = vpcmpeqd_avx(local_960,_DAT_01f45a50);
                    auVar146 = vpcmpeqd_avx(auVar146,auVar146);
                    auVar95 = auVar124 ^ auVar146;
                    if (local_960 != (undefined1  [16])0x0) {
                      auVar124 = auVar124 ^ auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])local_b70.hit);
                      *(undefined1 (*) [16])(local_b70.ray + 0xc0) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x10));
                      *(undefined1 (*) [16])(local_b70.ray + 0xd0) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x20));
                      *(undefined1 (*) [16])(local_b70.ray + 0xe0) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x30));
                      *(undefined1 (*) [16])(local_b70.ray + 0xf0) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x40));
                      *(undefined1 (*) [16])(local_b70.ray + 0x100) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x50));
                      *(undefined1 (*) [16])(local_b70.ray + 0x110) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x60));
                      *(undefined1 (*) [16])(local_b70.ray + 0x120) = auVar146;
                      auVar146 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x70));
                      *(undefined1 (*) [16])(local_b70.ray + 0x130) = auVar146;
                      auVar124 = vmaskmovps_avx(auVar124,*(undefined1 (*) [16])
                                                          (local_b70.hit + 0x80));
                      *(undefined1 (*) [16])(local_b70.ray + 0x140) = auVar124;
                    }
                  }
                  auVar243 = ZEXT464((uint)fVar140);
                  auVar100._8_8_ = 0x100000001;
                  auVar100._0_8_ = 0x100000001;
                  if ((auVar100 & auVar95) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar140;
                  }
                }
              }
            }
          }
        }
LAB_012c38ce:
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar239._4_4_ = uVar85;
        auVar239._0_4_ = uVar85;
        auVar239._8_4_ = uVar85;
        auVar239._12_4_ = uVar85;
        auVar239._16_4_ = uVar85;
        auVar239._20_4_ = uVar85;
        auVar239._24_4_ = uVar85;
        auVar239._28_4_ = uVar85;
        auVar240 = ZEXT3264(auVar239);
        auVar101 = vcmpps_avx(_local_860,auVar239,2);
      }
      auVar138._0_4_ = (float)local_900._0_4_ + local_4e0._0_4_;
      auVar138._4_4_ = (float)local_900._4_4_ + local_4e0._4_4_;
      auVar138._8_4_ = fStack_8f8 + local_4e0._8_4_;
      auVar138._12_4_ = fStack_8f4 + local_4e0._12_4_;
      auVar138._16_4_ = fStack_8f0 + local_4e0._16_4_;
      auVar138._20_4_ = fStack_8ec + local_4e0._20_4_;
      auVar138._24_4_ = fStack_8e8 + local_4e0._24_4_;
      auVar138._28_4_ = fStack_8e4 + local_4e0._28_4_;
      uVar85 = auVar240._0_4_;
      auVar190._4_4_ = uVar85;
      auVar190._0_4_ = uVar85;
      auVar190._8_4_ = uVar85;
      auVar190._12_4_ = uVar85;
      auVar190._16_4_ = uVar85;
      auVar190._20_4_ = uVar85;
      auVar190._24_4_ = uVar85;
      auVar190._28_4_ = uVar85;
      auVar227 = vcmpps_avx(auVar138,auVar190,2);
      auVar101 = vandps_avx(local_660,local_640);
      auVar101 = vandps_avx(auVar227,auVar101);
      auVar203._0_4_ = (float)local_900._0_4_ + local_4a0._0_4_;
      auVar203._4_4_ = (float)local_900._4_4_ + local_4a0._4_4_;
      auVar203._8_4_ = fStack_8f8 + local_4a0._8_4_;
      auVar203._12_4_ = fStack_8f4 + local_4a0._12_4_;
      auVar203._16_4_ = fStack_8f0 + local_4a0._16_4_;
      auVar203._20_4_ = fStack_8ec + local_4a0._20_4_;
      auVar203._24_4_ = fStack_8e8 + local_4a0._24_4_;
      auVar203._28_4_ = fStack_8e4 + local_4a0._28_4_;
      auVar109 = vcmpps_avx(auVar203,auVar190,2);
      auVar227 = vandps_avx(local_8a0,_local_880);
      auVar227 = vandps_avx(auVar109,auVar227);
      auVar227 = vorps_avx(auVar101,auVar227);
      if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar227 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar227 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar227 >> 0x7f,0) != '\0') ||
            (auVar227 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar227 >> 0xbf,0) != '\0') ||
          (auVar227 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar227[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar227;
        auVar101 = vblendvps_avx(_local_4a0,local_4e0,auVar101);
        *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x60) = auVar101;
        uVar19 = vmovlps_avx(local_610);
        (&uStack_140)[uVar81 * 0xc] = uVar19;
        aiStack_138[uVar81 * 0x18] = local_c64 + 1;
        uVar81 = (ulong)((int)uVar81 + 1);
      }
      fVar141 = (float)local_900._0_4_;
      fVar155 = (float)local_900._4_4_;
      fVar140 = fStack_8f8;
      fVar157 = fStack_8f4;
      fVar159 = fStack_8f0;
      fVar164 = fStack_8ec;
      fVar161 = fStack_8e8;
      fVar163 = fStack_8e4;
    }
    while( true ) {
      auVar197 = local_580;
      auVar227 = local_5a0;
      auVar241 = local_5c0;
      auVar246 = local_5e0;
      uVar79 = (uint)uVar81;
      if (uVar79 == 0) {
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar115._4_4_ = uVar85;
        auVar115._0_4_ = uVar85;
        auVar115._8_4_ = uVar85;
        auVar115._12_4_ = uVar85;
        auVar115._16_4_ = uVar85;
        auVar115._20_4_ = uVar85;
        auVar115._24_4_ = uVar85;
        auVar115._28_4_ = uVar85;
        auVar101 = vcmpps_avx(local_3c0,auVar115,2);
        uVar80 = vmovmskps_avx(auVar101);
        uVar86 = (ulong)((uint)uVar86 & uVar80);
        goto LAB_012c15dc;
      }
      uVar81 = (ulong)(uVar79 - 1);
      lVar82 = uVar81 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar108._0_4_ = fVar141 + auVar101._0_4_;
      auVar108._4_4_ = fVar155 + auVar101._4_4_;
      auVar108._8_4_ = fVar140 + auVar101._8_4_;
      auVar108._12_4_ = fVar157 + auVar101._12_4_;
      auVar108._16_4_ = fVar159 + auVar101._16_4_;
      auVar108._20_4_ = fVar164 + auVar101._20_4_;
      auVar108._24_4_ = fVar161 + auVar101._24_4_;
      auVar108._28_4_ = fVar163 + auVar101._28_4_;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar188._4_4_ = uVar85;
      auVar188._0_4_ = uVar85;
      auVar188._8_4_ = uVar85;
      auVar188._12_4_ = uVar85;
      auVar188._16_4_ = uVar85;
      auVar188._20_4_ = uVar85;
      auVar188._24_4_ = uVar85;
      auVar188._28_4_ = uVar85;
      auVar14 = vcmpps_avx(auVar108,auVar188,2);
      auVar109 = vandps_avx(auVar14,*(undefined1 (*) [32])(auStack_180 + lVar82));
      _local_780 = auVar109;
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar82) & auVar14;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') break;
      uVar81 = (ulong)(uVar79 - 1);
    }
    auVar151._8_4_ = 0x7f800000;
    auVar151._0_8_ = 0x7f8000007f800000;
    auVar151._12_4_ = 0x7f800000;
    auVar151._16_4_ = 0x7f800000;
    auVar151._20_4_ = 0x7f800000;
    auVar151._24_4_ = 0x7f800000;
    auVar151._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar151,auVar101,auVar109);
    auVar14 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar14 = vminps_avx(auVar101,auVar14);
    auVar15 = vshufpd_avx(auVar14,auVar14,5);
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar15 = vpermpd_avx2(auVar14,0x4e);
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar101 = vcmpps_avx(auVar101,auVar14,0);
    auVar14 = auVar109 & auVar101;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar109 = vandps_avx(auVar101,auVar109);
    }
    uVar83 = vmovmskps_avx(auVar109);
    iVar18 = 0;
    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
      iVar18 = iVar18 + 1;
    }
    *(undefined4 *)(local_780 + (uint)(iVar18 << 2)) = 0;
    uVar19 = (&uStack_140)[uVar81 * 0xc];
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar19;
    local_c64 = aiStack_138[uVar81 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar82) = _local_780;
    uVar83 = uVar79 - 1;
    if ((((((((_local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_780 >> 0x7f,0) != '\0') ||
          (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_780 >> 0xbf,0) != '\0') ||
        (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_780[0x1f] < '\0') {
      uVar83 = uVar79;
    }
    uVar85 = (undefined4)uVar19;
    auVar132._4_4_ = uVar85;
    auVar132._0_4_ = uVar85;
    auVar132._8_4_ = uVar85;
    auVar132._12_4_ = uVar85;
    auVar132._16_4_ = uVar85;
    auVar132._20_4_ = uVar85;
    auVar132._24_4_ = uVar85;
    auVar132._28_4_ = uVar85;
    auVar95 = vmovshdup_avx(auVar90);
    auVar95 = vsubps_avx(auVar95,auVar90);
    auVar110._0_4_ = auVar95._0_4_;
    auVar110._4_4_ = auVar110._0_4_;
    auVar110._8_4_ = auVar110._0_4_;
    auVar110._12_4_ = auVar110._0_4_;
    auVar110._16_4_ = auVar110._0_4_;
    auVar110._20_4_ = auVar110._0_4_;
    auVar110._24_4_ = auVar110._0_4_;
    auVar110._28_4_ = auVar110._0_4_;
    auVar95 = vfmadd132ps_fma(auVar110,auVar132,_DAT_01f7b040);
    local_4e0 = ZEXT1632(auVar95);
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_4e0 + (uint)(iVar18 << 2));
    uVar81 = (ulong)uVar83;
    auVar235 = auVar271._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }